

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar55;
  byte bVar56;
  ulong uVar57;
  byte bVar58;
  ulong uVar59;
  byte bVar60;
  long lVar61;
  bool bVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar140;
  uint uVar141;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar142;
  uint uVar146;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar147;
  float fVar166;
  float fVar167;
  vint4 bi_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar172;
  vint4 bi_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar186 [16];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  float fVar215;
  float fVar216;
  vint4 bi;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar217;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar225 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [32];
  undefined1 auVar231 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar245;
  vint4 ai;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar253;
  undefined1 auVar250 [32];
  undefined1 auVar249 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  vint4 ai_1;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  vint4 ai_2;
  undefined1 auVar259 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar260 [64];
  float fVar261;
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar266;
  float fVar267;
  undefined1 auVar265 [64];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  float fVar276;
  undefined1 auVar274 [32];
  undefined1 auVar275 [64];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar290;
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_afc;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  Primitive *local_670;
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  RTCHitN local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar158 [32];
  
  uVar63 = (ulong)(byte)prim[1];
  lVar55 = uVar63 * 0x25;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x11 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  fVar2 = *(float *)(prim + lVar55 + 0x12);
  auVar287._4_4_ = fVar2;
  auVar287._0_4_ = fVar2;
  auVar287._8_4_ = fVar2;
  auVar287._12_4_ = fVar2;
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar70 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar55 + 6));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  fVar261 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar55 + 0x16)) *
            *(float *)(prim + lVar55 + 0x1a);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar271 = vpmovsxwd_avx(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar149 = vpmovsxwd_avx(auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar174 = vpmovsxwd_avx(auVar85);
  auVar65 = vpbroadcastd_avx512vl();
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar66 = vpmovsxwd_avx512vl(auVar78);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar67 = vpmovsxwd_avx512vl(auVar3);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar63 * 0x16 + 6);
  auVar68 = vpmovsxwd_avx512vl(auVar69);
  auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar289._0_4_ = fVar2 * auVar70._0_4_;
  auVar289._4_4_ = fVar2 * auVar70._4_4_;
  auVar289._8_4_ = fVar2 * auVar70._8_4_;
  auVar289._12_4_ = fVar2 * auVar70._12_4_;
  auVar69 = vmulps_avx512vl(auVar287,auVar84);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar83 = vcvtdq2ps_avx(auVar77);
  auVar85 = vcvtdq2ps_avx(auVar86);
  auVar78 = vcvtdq2ps_avx(auVar79);
  uVar172 = auVar69._0_4_;
  auVar269._4_4_ = uVar172;
  auVar269._0_4_ = uVar172;
  auVar269._8_4_ = uVar172;
  auVar269._12_4_ = uVar172;
  auVar3 = vshufps_avx(auVar69,auVar69,0x55);
  auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar75 = vmulps_avx512vl(auVar69,auVar72);
  auVar173._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar173._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar173._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar173._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar148._0_4_ = auVar78._0_4_ * auVar69._0_4_;
  auVar148._4_4_ = auVar78._4_4_ * auVar69._4_4_;
  auVar148._8_4_ = auVar78._8_4_ * auVar69._8_4_;
  auVar148._12_4_ = auVar78._12_4_ * auVar69._12_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar75,auVar3,auVar71);
  auVar75 = vfmadd231ps_avx512vl(auVar173,auVar3,auVar74);
  auVar3 = vfmadd231ps_fma(auVar148,auVar85,auVar3);
  auVar76 = vfmadd231ps_avx512vl(auVar69,auVar269,auVar70);
  auVar77 = vfmadd231ps_avx512vl(auVar75,auVar269,auVar73);
  auVar75 = vfmadd231ps_fma(auVar3,auVar83,auVar269);
  auVar285._4_4_ = auVar289._0_4_;
  auVar285._0_4_ = auVar289._0_4_;
  auVar285._8_4_ = auVar289._0_4_;
  auVar285._12_4_ = auVar289._0_4_;
  auVar3 = vshufps_avx(auVar289,auVar289,0x55);
  auVar69 = vshufps_avx(auVar289,auVar289,0xaa);
  auVar72 = vmulps_avx512vl(auVar69,auVar72);
  auVar270._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar270._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar270._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar270._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar218._0_4_ = auVar69._0_4_ * auVar78._0_4_;
  auVar218._4_4_ = auVar69._4_4_ * auVar78._4_4_;
  auVar218._8_4_ = auVar69._8_4_ * auVar78._8_4_;
  auVar218._12_4_ = auVar69._12_4_ * auVar78._12_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar72,auVar3,auVar71);
  auVar69 = vfmadd231ps_avx512vl(auVar270,auVar3,auVar74);
  auVar84 = vfmadd231ps_fma(auVar218,auVar3,auVar85);
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar285,auVar70);
  auVar70 = vfmadd231ps_avx512vl(auVar69,auVar285,auVar73);
  auVar86 = vfmadd231ps_fma(auVar84,auVar285,auVar83);
  auVar280._8_4_ = 0x7fffffff;
  auVar280._0_8_ = 0x7fffffff7fffffff;
  auVar280._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar280,auVar76);
  auVar277._8_4_ = 0x219392ef;
  auVar277._0_8_ = 0x219392ef219392ef;
  auVar277._12_4_ = 0x219392ef;
  uVar57 = vcmpps_avx512vl(auVar84,auVar277,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar80._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar76._12_4_;
  auVar84 = vandps_avx(auVar280,auVar77);
  uVar57 = vcmpps_avx512vl(auVar84,auVar277,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar81._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._12_4_;
  auVar84 = vandps_avx(auVar280,auVar75);
  uVar57 = vcmpps_avx512vl(auVar84,auVar277,1);
  bVar62 = (bool)((byte)uVar57 & 1);
  auVar82._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._0_4_;
  bVar62 = (bool)((byte)(uVar57 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._4_4_;
  bVar62 = (bool)((byte)(uVar57 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._8_4_;
  bVar62 = (bool)((byte)(uVar57 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar75._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar80,auVar83,auVar278);
  auVar85 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar84 = vfnmadd213ps_fma(auVar81,auVar83,auVar278);
  auVar78 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar82);
  auVar84 = vfnmadd213ps_fma(auVar82,auVar83,auVar278);
  auVar3 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar246._4_4_ = fVar261;
  auVar246._0_4_ = fVar261;
  auVar246._8_4_ = fVar261;
  auVar246._12_4_ = fVar261;
  auVar84 = vcvtdq2ps_avx(auVar271);
  auVar83 = vcvtdq2ps_avx(auVar149);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar69 = vfmadd213ps_fma(auVar83,auVar246,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar174);
  auVar83 = vcvtdq2ps_avx512vl(auVar66);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar77 = vfmadd213ps_fma(auVar83,auVar246,auVar84);
  auVar71 = vcvtdq2ps_avx512vl(auVar67);
  auVar84 = vcvtdq2ps_avx512vl(auVar68);
  auVar83 = vsubps_avx(auVar84,auVar71);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar84 = vpmovsxwd_avx(auVar75);
  auVar75 = vfmadd213ps_fma(auVar83,auVar246,auVar71);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar83 = vpmovsxwd_avx(auVar71);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar71 = vfmadd213ps_fma(auVar83,auVar246,auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar72);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x21 + 6);
  auVar83 = vpmovsxwd_avx(auVar73);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar72 = vfmadd213ps_fma(auVar83,auVar246,auVar84);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar63 * 0x1f + 6);
  auVar84 = vpmovsxwd_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar83 = vpmovsxwd_avx(auVar76);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar83 = vfmadd213ps_fma(auVar83,auVar246,auVar84);
  auVar84 = vsubps_avx512vl(auVar69,auVar79);
  auVar67._0_4_ = auVar85._0_4_ * auVar84._0_4_;
  auVar67._4_4_ = auVar85._4_4_ * auVar84._4_4_;
  auVar67._8_4_ = auVar85._8_4_ * auVar84._8_4_;
  auVar67._12_4_ = auVar85._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx512vl(auVar77,auVar79);
  auVar66._0_4_ = auVar85._0_4_ * auVar84._0_4_;
  auVar66._4_4_ = auVar85._4_4_ * auVar84._4_4_;
  auVar66._8_4_ = auVar85._8_4_ * auVar84._8_4_;
  auVar66._12_4_ = auVar85._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar75,auVar70);
  auVar68._0_4_ = auVar78._0_4_ * auVar84._0_4_;
  auVar68._4_4_ = auVar78._4_4_ * auVar84._4_4_;
  auVar68._8_4_ = auVar78._8_4_ * auVar84._8_4_;
  auVar68._12_4_ = auVar78._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar71,auVar70);
  auVar174._0_4_ = auVar78._0_4_ * auVar84._0_4_;
  auVar174._4_4_ = auVar78._4_4_ * auVar84._4_4_;
  auVar174._8_4_ = auVar78._8_4_ * auVar84._8_4_;
  auVar174._12_4_ = auVar78._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar72,auVar86);
  auVar70._0_4_ = auVar3._0_4_ * auVar84._0_4_;
  auVar70._4_4_ = auVar3._4_4_ * auVar84._4_4_;
  auVar70._8_4_ = auVar3._8_4_ * auVar84._8_4_;
  auVar70._12_4_ = auVar3._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar83,auVar86);
  auVar149._0_4_ = auVar3._0_4_ * auVar84._0_4_;
  auVar149._4_4_ = auVar3._4_4_ * auVar84._4_4_;
  auVar149._8_4_ = auVar3._8_4_ * auVar84._8_4_;
  auVar149._12_4_ = auVar3._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar67,auVar66);
  auVar83 = vpminsd_avx(auVar68,auVar174);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83 = vpminsd_avx(auVar70,auVar149);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar77._4_4_ = uVar172;
  auVar77._0_4_ = uVar172;
  auVar77._8_4_ = uVar172;
  auVar77._12_4_ = uVar172;
  auVar83 = vmaxps_avx512vl(auVar83,auVar77);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  local_500 = vmulps_avx512vl(auVar84,auVar86);
  auVar84 = vpmaxsd_avx(auVar67,auVar66);
  auVar83 = vpmaxsd_avx(auVar68,auVar174);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar83 = vpmaxsd_avx(auVar70,auVar149);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar79._4_4_ = uVar172;
  auVar79._0_4_ = uVar172;
  auVar79._8_4_ = uVar172;
  auVar79._12_4_ = uVar172;
  auVar83 = vminps_avx512vl(auVar83,auVar79);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar271._8_4_ = 0x3f800003;
  auVar271._0_8_ = 0x3f8000033f800003;
  auVar271._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar271);
  uVar19 = vcmpps_avx512vl(local_500,auVar84,2);
  uVar21 = vpcmpgtd_avx512vl(auVar65,_DAT_01f4ad30);
  local_668 = (ulong)((byte)uVar19 & 0xf & (byte)uVar21);
  local_4e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar252 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_670 = prim;
LAB_018d7e12:
  if (local_668 == 0) {
LAB_018da8cb:
    return local_668 != 0;
  }
  lVar55 = 0;
  for (uVar57 = local_668; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar4 = *(uint *)(local_670 + 2);
  pGVar5 = (context->scene->geometries).items[uVar4].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_670 + lVar55 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar5->time_range).lower;
  fVar2 = pGVar5->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar5->time_range).upper - fVar2));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  fVar2 = fVar2 - auVar84._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar84._0_4_ * 0x38;
  lVar55 = *(long *)(_Var6 + 0x10 + lVar61);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar61);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar7 + uVar57 * lVar8);
  auVar150._0_4_ = fVar2 * *pfVar1;
  auVar150._4_4_ = fVar2 * pfVar1[1];
  auVar150._8_4_ = fVar2 * pfVar1[2];
  auVar150._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar57 + 1) * lVar8);
  auVar175._0_4_ = fVar2 * *pfVar1;
  auVar175._4_4_ = fVar2 * pfVar1[1];
  auVar175._8_4_ = fVar2 * pfVar1[2];
  auVar175._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar57 + 2) * lVar8);
  auVar193._0_4_ = fVar2 * *pfVar1;
  auVar193._4_4_ = fVar2 * pfVar1[1];
  auVar193._8_4_ = fVar2 * pfVar1[2];
  auVar193._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar57 + 3));
  auVar219._0_4_ = fVar2 * *pfVar1;
  auVar219._4_4_ = fVar2 * pfVar1[1];
  auVar219._8_4_ = fVar2 * pfVar1[2];
  auVar219._12_4_ = fVar2 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar61);
  auVar103 = auVar252._0_32_;
  auVar272 = ZEXT3264(auVar103);
  fVar2 = 1.0 - fVar2;
  auVar238._4_4_ = fVar2;
  auVar238._0_4_ = fVar2;
  auVar238._8_4_ = fVar2;
  auVar238._12_4_ = fVar2;
  auVar85 = vfmadd231ps_fma(auVar150,auVar238,*(undefined1 (*) [16])(lVar7 + lVar55 * uVar57));
  auVar78 = vfmadd231ps_fma(auVar175,auVar238,*(undefined1 (*) [16])(lVar7 + lVar55 * (uVar57 + 1)))
  ;
  auVar3 = vfmadd231ps_fma(auVar193,auVar238,*(undefined1 (*) [16])(lVar7 + lVar55 * (uVar57 + 2)));
  auVar69 = vfmadd231ps_fma(auVar219,auVar238,*(undefined1 (*) [16])(lVar7 + lVar55 * (uVar57 + 3)))
  ;
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar172 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar286._4_4_ = uVar172;
  auVar286._0_4_ = uVar172;
  auVar286._8_4_ = uVar172;
  auVar286._12_4_ = uVar172;
  local_580._16_4_ = uVar172;
  local_580._0_16_ = auVar286;
  local_580._20_4_ = uVar172;
  local_580._24_4_ = uVar172;
  local_580._28_4_ = uVar172;
  uVar172 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar288._4_4_ = uVar172;
  auVar288._0_4_ = uVar172;
  auVar288._8_4_ = uVar172;
  auVar288._12_4_ = uVar172;
  local_5a0._16_4_ = uVar172;
  local_5a0._0_16_ = auVar288;
  local_5a0._20_4_ = uVar172;
  local_5a0._24_4_ = uVar172;
  local_5a0._28_4_ = uVar172;
  auVar84 = vunpcklps_avx(auVar286,auVar288);
  local_5c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar72 = local_5c0._0_16_;
  local_7d0 = vinsertps_avx512f(auVar84,auVar72,0x28);
  auVar275 = ZEXT1664(local_7d0);
  auVar247._0_4_ = auVar85._0_4_ + auVar78._0_4_ + auVar3._0_4_ + auVar69._0_4_;
  auVar247._4_4_ = auVar85._4_4_ + auVar78._4_4_ + auVar3._4_4_ + auVar69._4_4_;
  auVar247._8_4_ = auVar85._8_4_ + auVar78._8_4_ + auVar3._8_4_ + auVar69._8_4_;
  auVar247._12_4_ = auVar85._12_4_ + auVar78._12_4_ + auVar3._12_4_ + auVar69._12_4_;
  auVar65._8_4_ = 0x3e800000;
  auVar65._0_8_ = 0x3e8000003e800000;
  auVar65._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar247,auVar65);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar84 = vdpps_avx(auVar84,local_7d0,0x7f);
  local_480 = vpbroadcastd_avx512vl();
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar279 = ZEXT1664(local_7e0);
  fVar2 = *(float *)(ray + k * 4 + 0x60);
  auVar284 = ZEXT464((uint)fVar2);
  auVar254._4_12_ = ZEXT812(0) << 0x20;
  auVar254._0_4_ = local_7e0._0_4_;
  auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar254);
  auVar75 = vfnmadd213ss_fma(auVar71,local_7e0,ZEXT416(0x40000000));
  local_2e0 = auVar84._0_4_ * auVar71._0_4_ * auVar75._0_4_;
  auVar252 = ZEXT464((uint)local_2e0);
  auVar255._4_4_ = local_2e0;
  auVar255._0_4_ = local_2e0;
  auVar255._8_4_ = local_2e0;
  auVar255._12_4_ = local_2e0;
  fStack_550 = local_2e0;
  _local_560 = auVar255;
  fStack_54c = local_2e0;
  fStack_548 = local_2e0;
  fStack_544 = local_2e0;
  auVar84 = vfmadd231ps_fma(auVar83,local_7d0,auVar255);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar85,auVar84);
  auVar85 = vsubps_avx(auVar3,auVar84);
  auVar260 = ZEXT1664(auVar85);
  auVar78 = vsubps_avx(auVar78,auVar84);
  auVar265 = ZEXT1664(auVar78);
  auVar84 = vsubps_avx(auVar69,auVar84);
  auVar87 = vbroadcastss_avx512vl(auVar83);
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  local_760 = ZEXT1632(auVar83);
  auVar88 = vpermps_avx512vl(auVar102,local_760);
  auVar291 = ZEXT3264(auVar88);
  auVar99._8_4_ = 2;
  auVar99._0_8_ = 0x200000002;
  auVar99._12_4_ = 2;
  auVar99._16_4_ = 2;
  auVar99._20_4_ = 2;
  auVar99._24_4_ = 2;
  auVar99._28_4_ = 2;
  auVar89 = vpermps_avx512vl(auVar99,local_760);
  auVar292 = ZEXT3264(auVar89);
  auVar100._8_4_ = 3;
  auVar100._0_8_ = 0x300000003;
  auVar100._12_4_ = 3;
  auVar100._16_4_ = 3;
  auVar100._20_4_ = 3;
  auVar100._24_4_ = 3;
  auVar100._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar100,local_760);
  auVar293 = ZEXT3264(auVar90);
  auVar91 = vbroadcastss_avx512vl(auVar78);
  local_7a0 = ZEXT1632(auVar78);
  auVar92 = vpermps_avx512vl(auVar102,local_7a0);
  auVar93 = vpermps_avx512vl(auVar99,local_7a0);
  auVar94 = vpermps_avx512vl(auVar100,local_7a0);
  auVar95 = vbroadcastss_avx512vl(auVar85);
  local_780 = ZEXT1632(auVar85);
  auVar96 = vpermps_avx512vl(auVar102,local_780);
  auVar97 = vpermps_avx512vl(auVar99,local_780);
  auVar98 = vpermps_avx512vl(auVar100,local_780);
  local_260 = vbroadcastss_avx512vl(auVar84);
  _local_7c0 = ZEXT1632(auVar84);
  local_280 = vpermps_avx2(auVar102,_local_7c0);
  local_2a0 = vpermps_avx512vl(auVar99,_local_7c0);
  local_2c0 = vpermps_avx2(auVar100,_local_7c0);
  auVar84 = vmulss_avx512f(auVar72,auVar72);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_5a0,local_5a0);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_580,local_580);
  local_220._0_4_ = auVar84._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar103,local_220);
  local_6d0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar2 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  uVar57 = 0;
  bVar54 = 0;
  local_afc = 1;
  local_4a0 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_7e0,local_7e0);
  auVar83 = vsqrtss_avx(local_7e0,local_7e0);
  local_4f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar85 = vmovshdup_avx(local_4f0);
    auVar85 = vsubps_avx(auVar85,local_4f0);
    auVar151._0_4_ = auVar85._0_4_;
    fVar18 = auVar151._0_4_ * 0.04761905;
    uVar172 = local_4f0._0_4_;
    auVar241._4_4_ = uVar172;
    auVar241._0_4_ = uVar172;
    auVar241._8_4_ = uVar172;
    auVar241._12_4_ = uVar172;
    auVar241._16_4_ = uVar172;
    auVar241._20_4_ = uVar172;
    auVar241._24_4_ = uVar172;
    auVar241._28_4_ = uVar172;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar158._16_4_ = auVar151._0_4_;
    auVar158._0_16_ = auVar151;
    auVar158._20_4_ = auVar151._0_4_;
    auVar158._24_4_ = auVar151._0_4_;
    auVar158._28_4_ = auVar151._0_4_;
    auVar85 = vfmadd231ps_fma(auVar241,auVar158,_DAT_01f7b040);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar100 = vsubps_avx512vl(auVar99,ZEXT1632(auVar85));
    fVar261 = auVar100._0_4_;
    fVar267 = auVar100._4_4_;
    fVar235 = auVar100._8_4_;
    fVar237 = auVar100._12_4_;
    fVar244 = auVar100._16_4_;
    fVar290 = auVar100._20_4_;
    fVar192 = auVar100._24_4_;
    fVar147 = fVar261 * fVar261 * fVar261;
    fVar166 = fVar267 * fVar267 * fVar267;
    auVar103._4_4_ = fVar166;
    auVar103._0_4_ = fVar147;
    fVar167 = fVar235 * fVar235 * fVar235;
    auVar103._8_4_ = fVar167;
    fVar168 = fVar237 * fVar237 * fVar237;
    auVar103._12_4_ = fVar168;
    fVar169 = fVar244 * fVar244 * fVar244;
    auVar103._16_4_ = fVar169;
    fVar170 = fVar290 * fVar290 * fVar290;
    auVar103._20_4_ = fVar170;
    fVar171 = fVar192 * fVar192 * fVar192;
    auVar103._24_4_ = fVar171;
    auVar103._28_4_ = auVar151._0_4_;
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar102 = vmulps_avx512vl(auVar103,auVar101);
    fVar266 = auVar85._0_4_;
    fVar268 = auVar85._4_4_;
    fVar236 = auVar85._8_4_;
    fVar245 = auVar85._12_4_;
    fVar191 = fVar266 * fVar266 * fVar266;
    fVar215 = fVar268 * fVar268 * fVar268;
    fVar216 = fVar236 * fVar236 * fVar236;
    fVar217 = fVar245 * fVar245 * fVar245;
    auVar123._28_4_ = DAT_01f7b040._28_4_;
    auVar123._0_28_ = ZEXT1628(CONCAT412(fVar217,CONCAT48(fVar216,CONCAT44(fVar215,fVar191))));
    auVar273._0_4_ = fVar266 * fVar261;
    auVar273._4_4_ = fVar268 * fVar267;
    auVar273._8_4_ = fVar236 * fVar235;
    auVar273._12_4_ = fVar245 * fVar237;
    auVar273._16_4_ = fVar244 * 0.0;
    auVar273._20_4_ = fVar290 * 0.0;
    auVar273._28_36_ = auVar272._28_36_;
    auVar273._24_4_ = fVar192 * 0.0;
    auVar103 = vmulps_avx512vl(auVar123,auVar101);
    fVar276 = auVar103._28_4_ + auVar151._0_4_;
    fVar253 = fVar276 + auVar279._28_4_ + auVar252._28_4_;
    auVar110._4_4_ = fVar166 * 0.16666667;
    auVar110._0_4_ = fVar147 * 0.16666667;
    auVar110._8_4_ = fVar167 * 0.16666667;
    auVar110._12_4_ = fVar168 * 0.16666667;
    auVar110._16_4_ = fVar169 * 0.16666667;
    auVar110._20_4_ = fVar170 * 0.16666667;
    auVar110._24_4_ = fVar171 * 0.16666667;
    auVar110._28_4_ = fVar276;
    auVar106._4_4_ =
         (auVar273._4_4_ * fVar267 * 12.0 + auVar273._4_4_ * fVar268 * 6.0 +
         fVar215 + auVar102._4_4_) * 0.16666667;
    auVar106._0_4_ =
         (auVar273._0_4_ * fVar261 * 12.0 + auVar273._0_4_ * fVar266 * 6.0 +
         fVar191 + auVar102._0_4_) * 0.16666667;
    auVar106._8_4_ =
         (auVar273._8_4_ * fVar235 * 12.0 + auVar273._8_4_ * fVar236 * 6.0 +
         fVar216 + auVar102._8_4_) * 0.16666667;
    auVar106._12_4_ =
         (auVar273._12_4_ * fVar237 * 12.0 + auVar273._12_4_ * fVar245 * 6.0 +
         fVar217 + auVar102._12_4_) * 0.16666667;
    auVar106._16_4_ =
         (auVar273._16_4_ * fVar244 * 12.0 + auVar273._16_4_ * 0.0 * 6.0 + auVar102._16_4_ + 0.0) *
         0.16666667;
    auVar106._20_4_ =
         (auVar273._20_4_ * fVar290 * 12.0 + auVar273._20_4_ * 0.0 * 6.0 + auVar102._20_4_ + 0.0) *
         0.16666667;
    auVar106._24_4_ =
         (auVar273._24_4_ * fVar192 * 12.0 + auVar273._24_4_ * 0.0 * 6.0 + auVar102._24_4_ + 0.0) *
         0.16666667;
    auVar106._28_4_ = auVar279._28_4_;
    auVar107._4_4_ =
         (auVar103._4_4_ + fVar166 +
         auVar273._4_4_ * fVar268 * 12.0 + auVar273._4_4_ * fVar267 * 6.0) * 0.16666667;
    auVar107._0_4_ =
         (auVar103._0_4_ + fVar147 +
         auVar273._0_4_ * fVar266 * 12.0 + auVar273._0_4_ * fVar261 * 6.0) * 0.16666667;
    auVar107._8_4_ =
         (auVar103._8_4_ + fVar167 +
         auVar273._8_4_ * fVar236 * 12.0 + auVar273._8_4_ * fVar235 * 6.0) * 0.16666667;
    auVar107._12_4_ =
         (auVar103._12_4_ + fVar168 +
         auVar273._12_4_ * fVar245 * 12.0 + auVar273._12_4_ * fVar237 * 6.0) * 0.16666667;
    auVar107._16_4_ =
         (auVar103._16_4_ + fVar169 + auVar273._16_4_ * 0.0 * 12.0 + auVar273._16_4_ * fVar244 * 6.0
         ) * 0.16666667;
    auVar107._20_4_ =
         (auVar103._20_4_ + fVar170 + auVar273._20_4_ * 0.0 * 12.0 + auVar273._20_4_ * fVar290 * 6.0
         ) * 0.16666667;
    auVar107._24_4_ =
         (auVar103._24_4_ + fVar171 + auVar273._24_4_ * 0.0 * 12.0 + auVar273._24_4_ * fVar192 * 6.0
         ) * 0.16666667;
    auVar107._28_4_ = auVar284._28_4_;
    fVar191 = fVar191 * 0.16666667;
    fVar215 = fVar215 * 0.16666667;
    fVar216 = fVar216 * 0.16666667;
    fVar217 = fVar217 * 0.16666667;
    auVar108._28_4_ = fVar253;
    auVar108._0_28_ = ZEXT1628(CONCAT412(fVar217,CONCAT48(fVar216,CONCAT44(fVar215,fVar191))));
    auVar103 = vmulps_avx512vl(local_260,auVar108);
    auVar109._4_4_ = local_280._4_4_ * fVar215;
    auVar109._0_4_ = local_280._0_4_ * fVar191;
    auVar109._8_4_ = local_280._8_4_ * fVar216;
    auVar109._12_4_ = local_280._12_4_ * fVar217;
    auVar109._16_4_ = local_280._16_4_ * 0.0;
    auVar109._20_4_ = local_280._20_4_ * 0.0;
    auVar109._24_4_ = local_280._24_4_ * 0.0;
    auVar109._28_4_ = auVar275._28_4_ + auVar284._28_4_ + DAT_01f7b040._28_4_ + auVar102._28_4_;
    auVar102 = vmulps_avx512vl(local_2a0,auVar108);
    auVar111._4_4_ = local_2c0._4_4_ * fVar215;
    auVar111._0_4_ = local_2c0._0_4_ * fVar191;
    auVar111._8_4_ = local_2c0._8_4_ * fVar216;
    auVar111._12_4_ = local_2c0._12_4_ * fVar217;
    auVar111._16_4_ = local_2c0._16_4_ * 0.0;
    auVar111._20_4_ = local_2c0._20_4_ * 0.0;
    auVar111._24_4_ = local_2c0._24_4_ * 0.0;
    auVar111._28_4_ = fVar253;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar95);
    auVar104 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar96);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar97);
    auVar105 = vfmadd231ps_avx512vl(auVar111,auVar98,auVar107);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar91);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar92);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar93);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar94,auVar106);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar110,auVar87);
    auVar107 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar291._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar102,auVar110,auVar292._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar105,auVar293._0_32_,auVar110);
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar110 = vxorps_avx512vl(auVar100,auVar109);
    auVar104 = vxorps_avx512vl(ZEXT1632(auVar85),auVar109);
    auVar124._0_4_ = auVar104._0_4_ * fVar266;
    auVar124._4_4_ = auVar104._4_4_ * fVar268;
    auVar124._8_4_ = auVar104._8_4_ * fVar236;
    auVar124._12_4_ = auVar104._12_4_ * fVar245;
    auVar124._16_4_ = auVar104._16_4_ * 0.0;
    auVar124._20_4_ = auVar104._20_4_ * 0.0;
    auVar124._24_4_ = auVar104._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar105 = vmulps_avx512vl(auVar273._0_32_,auVar101);
    auVar102 = vsubps_avx(auVar124,auVar105);
    auVar112._4_4_ = auVar110._4_4_ * fVar267 * 0.5;
    auVar112._0_4_ = auVar110._0_4_ * fVar261 * 0.5;
    auVar112._8_4_ = auVar110._8_4_ * fVar235 * 0.5;
    auVar112._12_4_ = auVar110._12_4_ * fVar237 * 0.5;
    auVar112._16_4_ = auVar110._16_4_ * fVar244 * 0.5;
    auVar112._20_4_ = auVar110._20_4_ * fVar290 * 0.5;
    auVar112._24_4_ = auVar110._24_4_ * fVar192 * 0.5;
    auVar112._28_4_ = auVar100._28_4_;
    auVar113._4_4_ = auVar102._4_4_ * 0.5;
    auVar113._0_4_ = auVar102._0_4_ * 0.5;
    auVar113._8_4_ = auVar102._8_4_ * 0.5;
    auVar113._12_4_ = auVar102._12_4_ * 0.5;
    auVar113._16_4_ = auVar102._16_4_ * 0.5;
    auVar113._20_4_ = auVar102._20_4_ * 0.5;
    auVar113._24_4_ = auVar102._24_4_ * 0.5;
    auVar113._28_4_ = auVar102._28_4_;
    auVar114._4_4_ = (auVar105._4_4_ + fVar267 * fVar267) * 0.5;
    auVar114._0_4_ = (auVar105._0_4_ + fVar261 * fVar261) * 0.5;
    auVar114._8_4_ = (auVar105._8_4_ + fVar235 * fVar235) * 0.5;
    auVar114._12_4_ = (auVar105._12_4_ + fVar237 * fVar237) * 0.5;
    auVar114._16_4_ = (auVar105._16_4_ + fVar244 * fVar244) * 0.5;
    auVar114._20_4_ = (auVar105._20_4_ + fVar290 * fVar290) * 0.5;
    auVar114._24_4_ = (auVar105._24_4_ + fVar192 * fVar192) * 0.5;
    auVar114._28_4_ = auVar105._28_4_ + auVar260._28_4_;
    fVar261 = fVar266 * fVar266 * 0.5;
    fVar266 = fVar268 * fVar268 * 0.5;
    fVar267 = fVar236 * fVar236 * 0.5;
    fVar268 = fVar245 * fVar245 * 0.5;
    auVar115._28_4_ = auVar265._28_4_;
    auVar115._0_28_ = ZEXT1628(CONCAT412(fVar268,CONCAT48(fVar267,CONCAT44(fVar266,fVar261))));
    auVar102 = vmulps_avx512vl(local_260,auVar115);
    auVar116._4_4_ = local_280._4_4_ * fVar266;
    auVar116._0_4_ = local_280._0_4_ * fVar261;
    auVar116._8_4_ = local_280._8_4_ * fVar267;
    auVar116._12_4_ = local_280._12_4_ * fVar268;
    auVar116._16_4_ = local_280._16_4_ * 0.0;
    auVar116._20_4_ = local_280._20_4_ * 0.0;
    auVar116._24_4_ = local_280._24_4_ * 0.0;
    auVar116._28_4_ = auVar104._28_4_;
    auVar100 = vmulps_avx512vl(local_2a0,auVar115);
    auVar120._4_4_ = fVar266 * local_2c0._4_4_;
    auVar120._0_4_ = fVar261 * local_2c0._0_4_;
    auVar120._8_4_ = fVar267 * local_2c0._8_4_;
    auVar120._12_4_ = fVar268 * local_2c0._12_4_;
    auVar120._16_4_ = local_2c0._16_4_ * 0.0;
    auVar120._20_4_ = local_2c0._20_4_ * 0.0;
    auVar120._24_4_ = local_2c0._24_4_ * 0.0;
    auVar120._28_4_ = auVar265._28_4_;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,auVar95);
    auVar110 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,auVar97);
    auVar85 = vfmadd231ps_fma(auVar120,auVar98,auVar114);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,auVar91);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar113,auVar93);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar94,auVar113);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,auVar87);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar291._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar292._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar293._0_32_,auVar112);
    auVar129._4_4_ = auVar102._4_4_ * fVar18;
    auVar129._0_4_ = auVar102._0_4_ * fVar18;
    auVar129._8_4_ = auVar102._8_4_ * fVar18;
    auVar129._12_4_ = auVar102._12_4_ * fVar18;
    auVar129._16_4_ = auVar102._16_4_ * fVar18;
    auVar129._20_4_ = auVar102._20_4_ * fVar18;
    auVar129._24_4_ = auVar102._24_4_ * fVar18;
    auVar129._28_4_ = auVar98._28_4_;
    auVar284 = ZEXT3264(auVar129);
    auVar130._4_4_ = auVar110._4_4_ * fVar18;
    auVar130._0_4_ = auVar110._0_4_ * fVar18;
    auVar130._8_4_ = auVar110._8_4_ * fVar18;
    auVar130._12_4_ = auVar110._12_4_ * fVar18;
    auVar130._16_4_ = auVar110._16_4_ * fVar18;
    auVar130._20_4_ = auVar110._20_4_ * fVar18;
    auVar130._24_4_ = auVar110._24_4_ * fVar18;
    auVar130._28_4_ = 0x3e2aaaab;
    auVar131._4_4_ = auVar100._4_4_ * fVar18;
    auVar131._0_4_ = auVar100._0_4_ * fVar18;
    auVar131._8_4_ = auVar100._8_4_ * fVar18;
    auVar131._12_4_ = auVar100._12_4_ * fVar18;
    auVar131._16_4_ = auVar100._16_4_ * fVar18;
    auVar131._20_4_ = auVar100._20_4_ * fVar18;
    auVar131._24_4_ = auVar100._24_4_ * fVar18;
    auVar131._28_4_ = 0x40c00000;
    fVar261 = auVar104._0_4_ * fVar18;
    fVar266 = auVar104._4_4_ * fVar18;
    auVar121._4_4_ = fVar266;
    auVar121._0_4_ = fVar261;
    fVar267 = auVar104._8_4_ * fVar18;
    auVar121._8_4_ = fVar267;
    fVar268 = auVar104._12_4_ * fVar18;
    auVar121._12_4_ = fVar268;
    fVar235 = auVar104._16_4_ * fVar18;
    auVar121._16_4_ = fVar235;
    fVar236 = auVar104._20_4_ * fVar18;
    auVar121._20_4_ = fVar236;
    fVar237 = auVar104._24_4_ * fVar18;
    auVar121._24_4_ = fVar237;
    auVar121._28_4_ = fVar18;
    auVar85 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
    auVar111 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,ZEXT1632(auVar85));
    auVar272 = ZEXT3264(auVar111);
    auVar112 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,ZEXT1632(auVar85));
    auVar275 = ZEXT3264(auVar112);
    auVar100 = ZEXT1632(auVar85);
    auVar113 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar100);
    auVar279 = ZEXT3264(auVar113);
    auVar125._0_4_ = fVar261 + auVar103._0_4_;
    auVar125._4_4_ = fVar266 + auVar103._4_4_;
    auVar125._8_4_ = fVar267 + auVar103._8_4_;
    auVar125._12_4_ = fVar268 + auVar103._12_4_;
    auVar125._16_4_ = fVar235 + auVar103._16_4_;
    auVar125._20_4_ = fVar236 + auVar103._20_4_;
    auVar125._24_4_ = fVar237 + auVar103._24_4_;
    auVar125._28_4_ = fVar18 + auVar103._28_4_;
    auVar102 = vmaxps_avx(auVar103,auVar125);
    auVar99 = vminps_avx(auVar103,auVar125);
    auVar105 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar100);
    auVar114 = vpermt2ps_avx512vl(auVar129,_DAT_01fb9fc0,auVar100);
    auVar115 = vpermt2ps_avx512vl(auVar130,_DAT_01fb9fc0,auVar100);
    auVar294 = ZEXT1632(auVar85);
    auVar116 = vpermt2ps_avx512vl(auVar131,_DAT_01fb9fc0,auVar294);
    auVar100 = vpermt2ps_avx512vl(auVar121,_DAT_01fb9fc0,auVar294);
    auVar117 = vsubps_avx512vl(auVar105,auVar100);
    auVar100 = vsubps_avx(auVar111,auVar106);
    auVar265 = ZEXT3264(auVar100);
    auVar103 = vsubps_avx(auVar112,auVar107);
    auVar260 = ZEXT3264(auVar103);
    auVar110 = vsubps_avx(auVar113,auVar108);
    auVar104 = vmulps_avx512vl(auVar103,auVar131);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar130,auVar110);
    auVar118 = vmulps_avx512vl(auVar110,auVar129);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar131,auVar100);
    auVar119 = vmulps_avx512vl(auVar100,auVar130);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar129,auVar103);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar110,auVar110);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar119 = vfmadd231ps_avx512vl(auVar104,auVar100,auVar100);
    auVar120 = vrcp14ps_avx512vl(auVar119);
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = 0x3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    auVar104 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar104);
    auVar104 = vfmadd132ps_avx512vl(auVar104,auVar120,auVar120);
    auVar118 = vmulps_avx512vl(auVar118,auVar104);
    auVar120 = vmulps_avx512vl(auVar103,auVar116);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar115,auVar110);
    auVar121 = vmulps_avx512vl(auVar110,auVar114);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar116,auVar100);
    auVar122 = vmulps_avx512vl(auVar100,auVar115);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar114,auVar103);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar104 = vmulps_avx512vl(auVar120,auVar104);
    auVar104 = vmaxps_avx512vl(auVar118,auVar104);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar118 = vmaxps_avx512vl(auVar117,auVar105);
    auVar102 = vmaxps_avx512vl(auVar102,auVar118);
    auVar120 = vaddps_avx512vl(auVar104,auVar102);
    auVar102 = vminps_avx512vl(auVar117,auVar105);
    auVar102 = vminps_avx(auVar99,auVar102);
    auVar102 = vsubps_avx512vl(auVar102,auVar104);
    auVar105._8_4_ = 0x3f800002;
    auVar105._0_8_ = 0x3f8000023f800002;
    auVar105._12_4_ = 0x3f800002;
    auVar105._16_4_ = 0x3f800002;
    auVar105._20_4_ = 0x3f800002;
    auVar105._24_4_ = 0x3f800002;
    auVar105._28_4_ = 0x3f800002;
    auVar99 = vmulps_avx512vl(auVar120,auVar105);
    auVar117._8_4_ = 0x3f7ffffc;
    auVar117._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar117._12_4_ = 0x3f7ffffc;
    auVar117._16_4_ = 0x3f7ffffc;
    auVar117._20_4_ = 0x3f7ffffc;
    auVar117._24_4_ = 0x3f7ffffc;
    auVar117._28_4_ = 0x3f7ffffc;
    auVar102 = vmulps_avx512vl(auVar102,auVar117);
    auVar99 = vmulps_avx512vl(auVar99,auVar99);
    auVar104 = vrsqrt14ps_avx512vl(auVar119);
    auVar118._8_4_ = 0xbf000000;
    auVar118._0_8_ = 0xbf000000bf000000;
    auVar118._12_4_ = 0xbf000000;
    auVar118._16_4_ = 0xbf000000;
    auVar118._20_4_ = 0xbf000000;
    auVar118._24_4_ = 0xbf000000;
    auVar118._28_4_ = 0xbf000000;
    auVar105 = vmulps_avx512vl(auVar119,auVar118);
    fVar261 = auVar104._0_4_;
    fVar266 = auVar104._4_4_;
    fVar267 = auVar104._8_4_;
    fVar268 = auVar104._12_4_;
    fVar235 = auVar104._16_4_;
    fVar236 = auVar104._20_4_;
    fVar237 = auVar104._24_4_;
    auVar122._4_4_ = fVar266 * fVar266 * fVar266 * auVar105._4_4_;
    auVar122._0_4_ = fVar261 * fVar261 * fVar261 * auVar105._0_4_;
    auVar122._8_4_ = fVar267 * fVar267 * fVar267 * auVar105._8_4_;
    auVar122._12_4_ = fVar268 * fVar268 * fVar268 * auVar105._12_4_;
    auVar122._16_4_ = fVar235 * fVar235 * fVar235 * auVar105._16_4_;
    auVar122._20_4_ = fVar236 * fVar236 * fVar236 * auVar105._20_4_;
    auVar122._24_4_ = fVar237 * fVar237 * fVar237 * auVar105._24_4_;
    auVar122._28_4_ = auVar120._28_4_;
    auVar119._8_4_ = 0x3fc00000;
    auVar119._0_8_ = 0x3fc000003fc00000;
    auVar119._12_4_ = 0x3fc00000;
    auVar119._16_4_ = 0x3fc00000;
    auVar119._20_4_ = 0x3fc00000;
    auVar119._24_4_ = 0x3fc00000;
    auVar119._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar122,auVar104,auVar119);
    auVar105 = vmulps_avx512vl(auVar100,auVar104);
    auVar117 = vmulps_avx512vl(auVar103,auVar104);
    auVar118 = vmulps_avx512vl(auVar110,auVar104);
    auVar119 = vsubps_avx512vl(auVar294,auVar106);
    auVar120 = vsubps_avx512vl(auVar294,auVar107);
    auVar121 = vsubps_avx512vl(auVar294,auVar108);
    auVar122 = vmulps_avx512vl(local_5c0,auVar121);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_5a0,auVar120);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_580,auVar119);
    auVar123 = vmulps_avx512vl(auVar121,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar119);
    auVar124 = vmulps_avx512vl(local_5c0,auVar118);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,local_5a0);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar105,local_580);
    auVar118 = vmulps_avx512vl(auVar121,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar120,auVar117);
    auVar105 = vfmadd231ps_avx512vl(auVar117,auVar119,auVar105);
    auVar117 = vmulps_avx512vl(auVar124,auVar124);
    auVar118 = vsubps_avx512vl(local_220,auVar117);
    auVar125 = vmulps_avx512vl(auVar124,auVar105);
    auVar122 = vsubps_avx512vl(auVar122,auVar125);
    auVar122 = vaddps_avx512vl(auVar122,auVar122);
    auVar125 = vmulps_avx512vl(auVar105,auVar105);
    local_800 = vsubps_avx512vl(auVar123,auVar125);
    auVar99 = vsubps_avx512vl(local_800,auVar99);
    local_720 = vmulps_avx512vl(auVar122,auVar122);
    auVar123 = vmulps_avx512vl(auVar118,auVar101);
    auVar125 = vmulps_avx512vl(auVar123,auVar99);
    auVar125 = vsubps_avx512vl(local_720,auVar125);
    auVar85 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
    uVar63 = vcmpps_avx512vl(auVar125,auVar294,5);
    bVar51 = (byte)uVar63;
    if (bVar51 == 0) {
LAB_018d8bb4:
      auVar252 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar102 = vmovdqa64_avx512vl(auVar88);
      auVar291 = ZEXT3264(auVar102);
      auVar102 = vmovdqa64_avx512vl(auVar89);
      auVar292 = ZEXT3264(auVar102);
      auVar102 = vmovdqa64_avx512vl(auVar90);
      auVar293 = ZEXT3264(auVar102);
    }
    else {
      auVar125 = vsqrtps_avx512vl(auVar125);
      auVar126 = vaddps_avx512vl(auVar118,auVar118);
      _local_600 = vrcp14ps_avx512vl(auVar126);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar101._16_4_ = 0x3f800000;
      auVar101._20_4_ = 0x3f800000;
      auVar101._24_4_ = 0x3f800000;
      auVar101._28_4_ = 0x3f800000;
      auVar101 = vfnmadd213ps_avx512vl(_local_600,auVar126,auVar101);
      auVar101 = vfmadd132ps_avx512vl(auVar101,_local_600,_local_600);
      local_620 = vxorps_avx512vl(auVar122,auVar109);
      auVar109 = vsubps_avx512vl(local_620,auVar125);
      local_5e0 = vmulps_avx512vl(auVar109,auVar101);
      auVar109 = vsubps_avx512vl(auVar125,auVar122);
      local_640 = vmulps_avx512vl(auVar109,auVar101);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar109,local_5e0);
      auVar127._0_4_ =
           (uint)(bVar51 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar109._0_4_;
      bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar62 * auVar101._4_4_ | (uint)!bVar62 * auVar109._4_4_;
      bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar62 * auVar101._8_4_ | (uint)!bVar62 * auVar109._8_4_;
      bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar62 * auVar101._12_4_ | (uint)!bVar62 * auVar109._12_4_;
      bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar62 * auVar101._16_4_ | (uint)!bVar62 * auVar109._16_4_;
      bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar62 * auVar101._20_4_ | (uint)!bVar62 * auVar109._20_4_;
      bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar62 * auVar101._24_4_ | (uint)!bVar62 * auVar109._24_4_;
      bVar62 = SUB81(uVar63 >> 7,0);
      auVar127._28_4_ = (uint)bVar62 * auVar101._28_4_ | (uint)!bVar62 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar109,local_640);
      auVar128._0_4_ =
           (uint)(bVar51 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar109._0_4_;
      bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar62 * auVar101._4_4_ | (uint)!bVar62 * auVar109._4_4_;
      bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar62 * auVar101._8_4_ | (uint)!bVar62 * auVar109._8_4_;
      bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar62 * auVar101._12_4_ | (uint)!bVar62 * auVar109._12_4_;
      bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar62 * auVar101._16_4_ | (uint)!bVar62 * auVar109._16_4_;
      bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar62 * auVar101._20_4_ | (uint)!bVar62 * auVar109._20_4_;
      bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar62 * auVar101._24_4_ | (uint)!bVar62 * auVar109._24_4_;
      bVar62 = SUB81(uVar63 >> 7,0);
      auVar128._28_4_ = (uint)bVar62 * auVar101._28_4_ | (uint)!bVar62 * auVar109._28_4_;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar109);
      local_660 = vmaxps_avx512vl(local_240,auVar109);
      auVar294._8_4_ = 0x36000000;
      auVar294._0_8_ = 0x3600000036000000;
      auVar294._12_4_ = 0x36000000;
      auVar294._16_4_ = 0x36000000;
      auVar294._20_4_ = 0x36000000;
      auVar294._24_4_ = 0x36000000;
      auVar294._28_4_ = 0x36000000;
      local_740 = vmulps_avx512vl(local_660,auVar294);
      vandps_avx512vl(auVar118,auVar109);
      uVar59 = vcmpps_avx512vl(local_740,local_740,1);
      uVar63 = uVar63 & uVar59;
      bVar60 = (byte)uVar63;
      if (bVar60 != 0) {
        uVar59 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar85),2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar118 = vblendmps_avx512vl(auVar99,auVar117);
        bVar56 = (byte)uVar59;
        uVar64 = (uint)(bVar56 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar56 & 1) * local_740._0_4_;
        bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar140 = (uint)bVar62 * auVar118._4_4_ | (uint)!bVar62 * local_740._4_4_;
        bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar141 = (uint)bVar62 * auVar118._8_4_ | (uint)!bVar62 * local_740._8_4_;
        bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar142 = (uint)bVar62 * auVar118._12_4_ | (uint)!bVar62 * local_740._12_4_;
        bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar143 = (uint)bVar62 * auVar118._16_4_ | (uint)!bVar62 * local_740._16_4_;
        bVar62 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar144 = (uint)bVar62 * auVar118._20_4_ | (uint)!bVar62 * local_740._20_4_;
        bVar62 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar145 = (uint)bVar62 * auVar118._24_4_ | (uint)!bVar62 * local_740._24_4_;
        bVar62 = SUB81(uVar59 >> 7,0);
        uVar146 = (uint)bVar62 * auVar118._28_4_ | (uint)!bVar62 * local_740._28_4_;
        auVar127._0_4_ = (bVar60 & 1) * uVar64 | !(bool)(bVar60 & 1) * auVar127._0_4_;
        bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar127._4_4_ = bVar62 * uVar140 | !bVar62 * auVar127._4_4_;
        bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar127._8_4_ = bVar62 * uVar141 | !bVar62 * auVar127._8_4_;
        bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar127._12_4_ = bVar62 * uVar142 | !bVar62 * auVar127._12_4_;
        bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar127._16_4_ = bVar62 * uVar143 | !bVar62 * auVar127._16_4_;
        bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar127._20_4_ = bVar62 * uVar144 | !bVar62 * auVar127._20_4_;
        bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar127._24_4_ = bVar62 * uVar145 | !bVar62 * auVar127._24_4_;
        bVar62 = SUB81(uVar63 >> 7,0);
        auVar127._28_4_ = bVar62 * uVar146 | !bVar62 * auVar127._28_4_;
        auVar99 = vblendmps_avx512vl(auVar117,auVar99);
        bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar16 = SUB81(uVar59 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar60 & 1) *
             ((uint)(bVar56 & 1) * auVar99._0_4_ | !(bool)(bVar56 & 1) * uVar64) |
             !(bool)(bVar60 & 1) * auVar128._0_4_;
        bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar10 * ((uint)bVar62 * auVar99._4_4_ | !bVar62 * uVar140) |
             !bVar10 * auVar128._4_4_;
        bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar62 * ((uint)bVar11 * auVar99._8_4_ | !bVar11 * uVar141) |
             !bVar62 * auVar128._8_4_;
        bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar62 * ((uint)bVar12 * auVar99._12_4_ | !bVar12 * uVar142) |
             !bVar62 * auVar128._12_4_;
        bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar62 * ((uint)bVar13 * auVar99._16_4_ | !bVar13 * uVar143) |
             !bVar62 * auVar128._16_4_;
        bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar62 * ((uint)bVar14 * auVar99._20_4_ | !bVar14 * uVar144) |
             !bVar62 * auVar128._20_4_;
        bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar62 * ((uint)bVar15 * auVar99._24_4_ | !bVar15 * uVar145) |
             !bVar62 * auVar128._24_4_;
        bVar62 = SUB81(uVar63 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar62 * ((uint)bVar16 * auVar99._28_4_ | !bVar16 * uVar146) |
             !bVar62 * auVar128._28_4_;
        bVar51 = (~bVar60 | bVar56) & bVar51;
      }
      if ((bVar51 & 0x7f) == 0) {
        auVar252 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar102 = vmovdqa64_avx512vl(auVar88);
        auVar291 = ZEXT3264(auVar102);
        auVar102 = vmovdqa64_avx512vl(auVar89);
        auVar292 = ZEXT3264(auVar102);
        auVar102 = vmovdqa64_avx512vl(auVar90);
        auVar293 = ZEXT3264(auVar102);
      }
      else {
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar117 = vxorps_avx512vl(auVar116,auVar99);
        auVar118 = vxorps_avx512vl(auVar114,auVar99);
        auVar252 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar109 = vxorps_avx512vl(auVar115,auVar99);
        auVar85 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6d0._0_4_));
        auVar114 = vbroadcastss_avx512vl(auVar85);
        auVar114 = vminps_avx512vl(auVar114,auVar128);
        auVar50._4_4_ = fStack_2dc;
        auVar50._0_4_ = local_2e0;
        auVar50._8_4_ = fStack_2d8;
        auVar50._12_4_ = fStack_2d4;
        auVar50._16_4_ = fStack_2d0;
        auVar50._20_4_ = fStack_2cc;
        auVar50._24_4_ = fStack_2c8;
        auVar50._28_4_ = fStack_2c4;
        auVar115 = vmaxps_avx512vl(auVar50,auVar127);
        auVar116 = vmulps_avx512vl(auVar131,auVar121);
        auVar116 = vfmadd213ps_avx512vl(auVar120,auVar130,auVar116);
        auVar85 = vfmadd213ps_fma(auVar119,auVar129,auVar116);
        auVar119 = vmulps_avx512vl(local_5c0,auVar131);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_5a0,auVar130);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_580,auVar129);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar119,auVar116);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar116,auVar120,1);
        auVar129 = vxorps_avx512vl(ZEXT1632(auVar85),auVar99);
        auVar130 = vrcp14ps_avx512vl(auVar119);
        auVar131 = vxorps_avx512vl(auVar119,auVar99);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar101 = vfnmadd213ps_avx512vl(auVar130,auVar119,auVar121);
        auVar85 = vfmadd132ps_fma(auVar101,auVar130,auVar130);
        fVar261 = auVar85._0_4_ * auVar129._0_4_;
        fVar266 = auVar85._4_4_ * auVar129._4_4_;
        auVar34._4_4_ = fVar266;
        auVar34._0_4_ = fVar261;
        fVar267 = auVar85._8_4_ * auVar129._8_4_;
        auVar34._8_4_ = fVar267;
        fVar268 = auVar85._12_4_ * auVar129._12_4_;
        auVar34._12_4_ = fVar268;
        fVar235 = auVar129._16_4_ * 0.0;
        auVar34._16_4_ = fVar235;
        fVar236 = auVar129._20_4_ * 0.0;
        auVar34._20_4_ = fVar236;
        fVar237 = auVar129._24_4_ * 0.0;
        auVar34._24_4_ = fVar237;
        auVar34._28_4_ = auVar129._28_4_;
        uVar21 = vcmpps_avx512vl(auVar119,auVar131,1);
        bVar60 = (byte)uVar19 | (byte)uVar21;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar125 = vblendmps_avx512vl(auVar34,auVar101);
        auVar132._0_4_ =
             (uint)(bVar60 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar130._0_4_;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar62 * auVar125._4_4_ | (uint)!bVar62 * auVar130._4_4_;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar62 * auVar125._8_4_ | (uint)!bVar62 * auVar130._8_4_;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar62 * auVar125._12_4_ | (uint)!bVar62 * auVar130._12_4_;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar62 * auVar125._16_4_ | (uint)!bVar62 * auVar130._16_4_;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar62 * auVar125._20_4_ | (uint)!bVar62 * auVar130._20_4_;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar62 * auVar125._24_4_ | (uint)!bVar62 * auVar130._24_4_;
        auVar132._28_4_ =
             (uint)(bVar60 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar130._28_4_;
        auVar130 = vmaxps_avx512vl(auVar115,auVar132);
        auVar284 = ZEXT3264(auVar130);
        uVar21 = vcmpps_avx512vl(auVar119,auVar131,6);
        bVar60 = (byte)uVar19 | (byte)uVar21;
        auVar133._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar261;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar266;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar267;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar268;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar235;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar236;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar237;
        auVar133._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar129._28_4_;
        auVar119 = vminps_avx512vl(auVar114,auVar133);
        auVar85 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
        auVar111 = vsubps_avx512vl(ZEXT1632(auVar85),auVar111);
        auVar112 = vsubps_avx512vl(ZEXT1632(auVar85),auVar112);
        auVar114 = ZEXT1632(auVar85);
        auVar113 = vsubps_avx512vl(auVar114,auVar113);
        auVar113 = vmulps_avx512vl(auVar113,auVar117);
        auVar112 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar112);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar118,auVar111);
        auVar117 = vmulps_avx512vl(local_5c0,auVar117);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_5a0,auVar109);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_580,auVar118);
        vandps_avx512vl(auVar117,auVar116);
        uVar19 = vcmpps_avx512vl(auVar117,auVar120,1);
        auVar118 = vxorps_avx512vl(auVar111,auVar99);
        auVar109 = vrcp14ps_avx512vl(auVar117);
        auVar111 = vxorps_avx512vl(auVar117,auVar99);
        auVar279 = ZEXT3264(auVar111);
        auVar99 = vfnmadd213ps_avx512vl(auVar109,auVar117,auVar121);
        auVar85 = vfmadd132ps_fma(auVar99,auVar109,auVar109);
        fVar261 = auVar85._0_4_ * auVar118._0_4_;
        fVar266 = auVar85._4_4_ * auVar118._4_4_;
        auVar35._4_4_ = fVar266;
        auVar35._0_4_ = fVar261;
        fVar267 = auVar85._8_4_ * auVar118._8_4_;
        auVar35._8_4_ = fVar267;
        fVar268 = auVar85._12_4_ * auVar118._12_4_;
        auVar35._12_4_ = fVar268;
        fVar235 = auVar118._16_4_ * 0.0;
        auVar35._16_4_ = fVar235;
        fVar236 = auVar118._20_4_ * 0.0;
        auVar35._20_4_ = fVar236;
        fVar237 = auVar118._24_4_ * 0.0;
        auVar35._24_4_ = fVar237;
        auVar35._28_4_ = auVar118._28_4_;
        uVar21 = vcmpps_avx512vl(auVar117,auVar111,1);
        bVar60 = (byte)uVar19 | (byte)uVar21;
        auVar99 = vblendmps_avx512vl(auVar35,auVar101);
        auVar134._0_4_ =
             (uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar109._0_4_;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar62 * auVar99._4_4_ | (uint)!bVar62 * auVar109._4_4_;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar62 * auVar99._8_4_ | (uint)!bVar62 * auVar109._8_4_;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar62 * auVar99._12_4_ | (uint)!bVar62 * auVar109._12_4_;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar62 * auVar99._16_4_ | (uint)!bVar62 * auVar109._16_4_;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar62 * auVar99._20_4_ | (uint)!bVar62 * auVar109._20_4_;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar62 * auVar99._24_4_ | (uint)!bVar62 * auVar109._24_4_;
        auVar134._28_4_ =
             (uint)(bVar60 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar109._28_4_;
        auVar99 = vmaxps_avx(auVar130,auVar134);
        auVar275 = ZEXT3264(auVar99);
        uVar21 = vcmpps_avx512vl(auVar117,auVar111,6);
        bVar60 = (byte)uVar19 | (byte)uVar21;
        auVar135._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar261;
        bVar62 = (bool)(bVar60 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar266;
        bVar62 = (bool)(bVar60 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar267;
        bVar62 = (bool)(bVar60 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar268;
        bVar62 = (bool)(bVar60 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar235;
        bVar62 = (bool)(bVar60 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar236;
        bVar62 = (bool)(bVar60 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar237;
        auVar135._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar118._28_4_;
        local_320 = vminps_avx(auVar119,auVar135);
        auVar272 = ZEXT3264(local_320);
        uVar19 = vcmpps_avx512vl(auVar99,local_320,2);
        bVar51 = bVar51 & 0x7f & (byte)uVar19;
        if (bVar51 == 0) goto LAB_018d8bb4;
        auVar117 = vmaxps_avx512vl(auVar114,auVar102);
        auVar102 = vfmadd213ps_avx512vl(local_5e0,auVar124,auVar105);
        fVar261 = auVar104._0_4_;
        fVar266 = auVar104._4_4_;
        auVar36._4_4_ = fVar266 * auVar102._4_4_;
        auVar36._0_4_ = fVar261 * auVar102._0_4_;
        fVar267 = auVar104._8_4_;
        auVar36._8_4_ = fVar267 * auVar102._8_4_;
        fVar268 = auVar104._12_4_;
        auVar36._12_4_ = fVar268 * auVar102._12_4_;
        fVar235 = auVar104._16_4_;
        auVar36._16_4_ = fVar235 * auVar102._16_4_;
        fVar236 = auVar104._20_4_;
        auVar36._20_4_ = fVar236 * auVar102._20_4_;
        fVar237 = auVar104._24_4_;
        auVar36._24_4_ = fVar237 * auVar102._24_4_;
        auVar36._28_4_ = auVar102._28_4_;
        auVar102 = vfmadd213ps_avx512vl(local_640,auVar124,auVar105);
        auVar37._4_4_ = fVar266 * auVar102._4_4_;
        auVar37._0_4_ = fVar261 * auVar102._0_4_;
        auVar37._8_4_ = fVar267 * auVar102._8_4_;
        auVar37._12_4_ = fVar268 * auVar102._12_4_;
        auVar37._16_4_ = fVar235 * auVar102._16_4_;
        auVar37._20_4_ = fVar236 * auVar102._20_4_;
        auVar37._24_4_ = fVar237 * auVar102._24_4_;
        auVar37._28_4_ = auVar102._28_4_;
        auVar102 = vminps_avx512vl(auVar36,auVar121);
        auVar45 = ZEXT812(0);
        auVar118 = ZEXT1232(auVar45) << 0x20;
        auVar102 = vmaxps_avx(auVar102,ZEXT1232(auVar45) << 0x20);
        auVar119 = vminps_avx512vl(auVar37,auVar121);
        auVar38._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar102._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar38,auVar158,auVar241);
        auVar102 = vmaxps_avx(auVar119,ZEXT1232(auVar45) << 0x20);
        auVar39._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar102._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar39,auVar158,auVar241);
        auVar40._4_4_ = auVar117._4_4_ * auVar117._4_4_;
        auVar40._0_4_ = auVar117._0_4_ * auVar117._0_4_;
        auVar40._8_4_ = auVar117._8_4_ * auVar117._8_4_;
        auVar40._12_4_ = auVar117._12_4_ * auVar117._12_4_;
        auVar40._16_4_ = auVar117._16_4_ * auVar117._16_4_;
        auVar40._20_4_ = auVar117._20_4_ * auVar117._20_4_;
        auVar40._24_4_ = auVar117._24_4_ * auVar117._24_4_;
        auVar40._28_4_ = auVar117._28_4_;
        auVar102 = vsubps_avx(local_800,auVar40);
        local_880 = auVar123._0_4_;
        fStack_87c = auVar123._4_4_;
        fStack_878 = auVar123._8_4_;
        fStack_874 = auVar123._12_4_;
        fStack_870 = auVar123._16_4_;
        fStack_86c = auVar123._20_4_;
        fStack_868 = auVar123._24_4_;
        auVar41._4_4_ = auVar102._4_4_ * fStack_87c;
        auVar41._0_4_ = auVar102._0_4_ * local_880;
        auVar41._8_4_ = auVar102._8_4_ * fStack_878;
        auVar41._12_4_ = auVar102._12_4_ * fStack_874;
        auVar41._16_4_ = auVar102._16_4_ * fStack_870;
        auVar41._20_4_ = auVar102._20_4_ * fStack_86c;
        auVar41._24_4_ = auVar102._24_4_ * fStack_868;
        auVar41._28_4_ = auVar117._28_4_;
        auVar117 = vsubps_avx(local_720,auVar41);
        uVar19 = vcmpps_avx512vl(auVar117,ZEXT1232(auVar45) << 0x20,5);
        bVar60 = (byte)uVar19;
        if (bVar60 == 0) {
          bVar60 = 0;
          auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar260 = ZEXT864(0) << 0x20;
          auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar119 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar275 = ZEXT864(0) << 0x20;
          auVar126._8_4_ = 0x7f800000;
          auVar126._0_8_ = 0x7f8000007f800000;
          auVar126._12_4_ = 0x7f800000;
          auVar126._16_4_ = 0x7f800000;
          auVar126._20_4_ = 0x7f800000;
          auVar126._24_4_ = 0x7f800000;
          auVar126._28_4_ = 0x7f800000;
          auVar136._8_4_ = 0xff800000;
          auVar136._0_8_ = 0xff800000ff800000;
          auVar136._12_4_ = 0xff800000;
          auVar136._16_4_ = 0xff800000;
          auVar136._20_4_ = 0xff800000;
          auVar136._24_4_ = 0xff800000;
          auVar136._28_4_ = 0xff800000;
        }
        else {
          auVar78 = vxorps_avx512vl(auVar151,auVar151);
          uVar63 = vcmpps_avx512vl(auVar117,auVar114,5);
          auVar117 = vsqrtps_avx(auVar117);
          auVar118 = vfnmadd213ps_avx512vl(auVar126,_local_600,auVar121);
          auVar85 = vfmadd132ps_fma(auVar118,_local_600,_local_600);
          auVar118 = vsubps_avx(local_620,auVar117);
          auVar42._4_4_ = auVar85._4_4_ * auVar118._4_4_;
          auVar42._0_4_ = auVar85._0_4_ * auVar118._0_4_;
          auVar42._8_4_ = auVar85._8_4_ * auVar118._8_4_;
          auVar42._12_4_ = auVar85._12_4_ * auVar118._12_4_;
          auVar42._16_4_ = auVar118._16_4_ * 0.0;
          auVar42._20_4_ = auVar118._20_4_ * 0.0;
          auVar42._24_4_ = auVar118._24_4_ * 0.0;
          auVar42._28_4_ = 0x3e000000;
          auVar117 = vsubps_avx512vl(auVar117,auVar122);
          auVar43._4_4_ = auVar85._4_4_ * auVar117._4_4_;
          auVar43._0_4_ = auVar85._0_4_ * auVar117._0_4_;
          auVar43._8_4_ = auVar85._8_4_ * auVar117._8_4_;
          auVar43._12_4_ = auVar85._12_4_ * auVar117._12_4_;
          auVar43._16_4_ = auVar117._16_4_ * 0.0;
          auVar43._20_4_ = auVar117._20_4_ * 0.0;
          auVar43._24_4_ = auVar117._24_4_ * 0.0;
          auVar43._28_4_ = uVar172;
          auVar117 = vfmadd213ps_avx512vl(auVar124,auVar42,auVar105);
          auVar274._0_4_ = fVar261 * auVar117._0_4_;
          auVar274._4_4_ = fVar266 * auVar117._4_4_;
          auVar274._8_4_ = fVar267 * auVar117._8_4_;
          auVar274._12_4_ = fVar268 * auVar117._12_4_;
          auVar274._16_4_ = fVar235 * auVar117._16_4_;
          auVar274._20_4_ = fVar236 * auVar117._20_4_;
          auVar274._24_4_ = fVar237 * auVar117._24_4_;
          auVar274._28_4_ = 0;
          auVar117 = vmulps_avx512vl(local_580,auVar42);
          auVar118 = vmulps_avx512vl(local_5a0,auVar42);
          auVar109 = vmulps_avx512vl(local_5c0,auVar42);
          auVar119 = vfmadd213ps_avx512vl(auVar100,auVar274,auVar106);
          auVar117 = vsubps_avx512vl(auVar117,auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar103,auVar274,auVar107);
          auVar119 = vsubps_avx512vl(auVar118,auVar119);
          auVar85 = vfmadd213ps_fma(auVar274,auVar110,auVar108);
          auVar118 = vsubps_avx(auVar109,ZEXT1632(auVar85));
          auVar275 = ZEXT3264(auVar118);
          auVar105 = vfmadd213ps_avx512vl(auVar124,auVar43,auVar105);
          auVar104 = vmulps_avx512vl(auVar104,auVar105);
          auVar105 = vmulps_avx512vl(local_580,auVar43);
          auVar109 = vmulps_avx512vl(local_5a0,auVar43);
          auVar111 = vmulps_avx512vl(local_5c0,auVar43);
          auVar85 = vfmadd213ps_fma(auVar100,auVar104,auVar106);
          auVar118 = vsubps_avx(auVar105,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar103,auVar104,auVar107);
          auVar100 = vsubps_avx512vl(auVar109,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar110,auVar104,auVar108);
          auVar103 = vsubps_avx512vl(auVar111,ZEXT1632(auVar85));
          auVar260 = ZEXT3264(auVar103);
          auVar159._8_4_ = 0x7f800000;
          auVar159._0_8_ = 0x7f8000007f800000;
          auVar159._12_4_ = 0x7f800000;
          auVar159._16_4_ = 0x7f800000;
          auVar159._20_4_ = 0x7f800000;
          auVar159._24_4_ = 0x7f800000;
          auVar159._28_4_ = 0x7f800000;
          auVar103 = vblendmps_avx512vl(auVar159,auVar42);
          bVar62 = (bool)((byte)uVar63 & 1);
          auVar126._0_4_ = (uint)bVar62 * auVar103._0_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar62 * auVar103._4_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar62 * auVar103._8_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar62 * auVar103._12_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar62 * auVar103._16_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar62 * auVar103._20_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar62 * auVar103._24_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = SUB81(uVar63 >> 7,0);
          auVar126._28_4_ = (uint)bVar62 * auVar103._28_4_ | (uint)!bVar62 * 0x7f800000;
          auVar212._8_4_ = 0xff800000;
          auVar212._0_8_ = 0xff800000ff800000;
          auVar212._12_4_ = 0xff800000;
          auVar212._16_4_ = 0xff800000;
          auVar212._20_4_ = 0xff800000;
          auVar212._24_4_ = 0xff800000;
          auVar212._28_4_ = 0xff800000;
          auVar103 = vblendmps_avx512vl(auVar212,auVar43);
          bVar62 = (bool)((byte)uVar63 & 1);
          auVar136._0_4_ = (uint)bVar62 * auVar103._0_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar62 * auVar103._4_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar62 * auVar103._8_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar62 * auVar103._12_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar62 * auVar103._16_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar62 * auVar103._20_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar62 * auVar103._24_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = SUB81(uVar63 >> 7,0);
          auVar136._28_4_ = (uint)bVar62 * auVar103._28_4_ | (uint)!bVar62 * -0x800000;
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar103 = vmulps_avx512vl(local_660,auVar30);
          uVar59 = vcmpps_avx512vl(auVar103,local_740,0xe);
          uVar63 = uVar63 & uVar59;
          bVar56 = (byte)uVar63;
          if (bVar56 != 0) {
            uVar59 = vcmpps_avx512vl(auVar102,ZEXT1632(auVar78),2);
            auVar264._8_4_ = 0x7f800000;
            auVar264._0_8_ = 0x7f8000007f800000;
            auVar264._12_4_ = 0x7f800000;
            auVar264._16_4_ = 0x7f800000;
            auVar264._20_4_ = 0x7f800000;
            auVar264._24_4_ = 0x7f800000;
            auVar264._28_4_ = 0x7f800000;
            auVar283._8_4_ = 0xff800000;
            auVar283._0_8_ = 0xff800000ff800000;
            auVar283._12_4_ = 0xff800000;
            auVar283._16_4_ = 0xff800000;
            auVar283._20_4_ = 0xff800000;
            auVar283._24_4_ = 0xff800000;
            auVar283._28_4_ = 0xff800000;
            auVar102 = vblendmps_avx512vl(auVar264,auVar283);
            bVar52 = (byte)uVar59;
            uVar64 = (uint)(bVar52 & 1) * auVar102._0_4_ |
                     (uint)!(bool)(bVar52 & 1) * auVar103._0_4_;
            bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
            uVar140 = (uint)bVar62 * auVar102._4_4_ | (uint)!bVar62 * auVar103._4_4_;
            bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
            uVar141 = (uint)bVar62 * auVar102._8_4_ | (uint)!bVar62 * auVar103._8_4_;
            bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
            uVar142 = (uint)bVar62 * auVar102._12_4_ | (uint)!bVar62 * auVar103._12_4_;
            bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
            uVar143 = (uint)bVar62 * auVar102._16_4_ | (uint)!bVar62 * auVar103._16_4_;
            bVar62 = (bool)((byte)(uVar59 >> 5) & 1);
            uVar144 = (uint)bVar62 * auVar102._20_4_ | (uint)!bVar62 * auVar103._20_4_;
            bVar62 = (bool)((byte)(uVar59 >> 6) & 1);
            uVar145 = (uint)bVar62 * auVar102._24_4_ | (uint)!bVar62 * auVar103._24_4_;
            bVar62 = SUB81(uVar59 >> 7,0);
            uVar146 = (uint)bVar62 * auVar102._28_4_ | (uint)!bVar62 * auVar103._28_4_;
            auVar126._0_4_ = (bVar56 & 1) * uVar64 | !(bool)(bVar56 & 1) * auVar126._0_4_;
            bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar126._4_4_ = bVar62 * uVar140 | !bVar62 * auVar126._4_4_;
            bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar126._8_4_ = bVar62 * uVar141 | !bVar62 * auVar126._8_4_;
            bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar126._12_4_ = bVar62 * uVar142 | !bVar62 * auVar126._12_4_;
            bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar126._16_4_ = bVar62 * uVar143 | !bVar62 * auVar126._16_4_;
            bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar126._20_4_ = bVar62 * uVar144 | !bVar62 * auVar126._20_4_;
            bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar126._24_4_ = bVar62 * uVar145 | !bVar62 * auVar126._24_4_;
            bVar62 = SUB81(uVar63 >> 7,0);
            auVar126._28_4_ = bVar62 * uVar146 | !bVar62 * auVar126._28_4_;
            auVar102 = vblendmps_avx512vl(auVar283,auVar264);
            bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar59 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar59 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar59 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar59 >> 6) & 1);
            bVar16 = SUB81(uVar59 >> 7,0);
            auVar136._0_4_ =
                 (uint)(bVar56 & 1) *
                 ((uint)(bVar52 & 1) * auVar102._0_4_ | !(bool)(bVar52 & 1) * uVar64) |
                 !(bool)(bVar56 & 1) * auVar136._0_4_;
            bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar136._4_4_ =
                 (uint)bVar10 * ((uint)bVar62 * auVar102._4_4_ | !bVar62 * uVar140) |
                 !bVar10 * auVar136._4_4_;
            bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar136._8_4_ =
                 (uint)bVar62 * ((uint)bVar11 * auVar102._8_4_ | !bVar11 * uVar141) |
                 !bVar62 * auVar136._8_4_;
            bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar136._12_4_ =
                 (uint)bVar62 * ((uint)bVar12 * auVar102._12_4_ | !bVar12 * uVar142) |
                 !bVar62 * auVar136._12_4_;
            bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar136._16_4_ =
                 (uint)bVar62 * ((uint)bVar13 * auVar102._16_4_ | !bVar13 * uVar143) |
                 !bVar62 * auVar136._16_4_;
            bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar136._20_4_ =
                 (uint)bVar62 * ((uint)bVar14 * auVar102._20_4_ | !bVar14 * uVar144) |
                 !bVar62 * auVar136._20_4_;
            bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar136._24_4_ =
                 (uint)bVar62 * ((uint)bVar15 * auVar102._24_4_ | !bVar15 * uVar145) |
                 !bVar62 * auVar136._24_4_;
            bVar62 = SUB81(uVar63 >> 7,0);
            auVar136._28_4_ =
                 (uint)bVar62 * ((uint)bVar16 * auVar102._28_4_ | !bVar16 * uVar146) |
                 !bVar62 * auVar136._28_4_;
            bVar60 = (~bVar56 | bVar52) & bVar60;
          }
        }
        auVar102 = vmovdqa64_avx512vl(auVar88);
        auVar291 = ZEXT3264(auVar102);
        auVar102 = vmovdqa64_avx512vl(auVar89);
        auVar292 = ZEXT3264(auVar102);
        auVar102 = vmovdqa64_avx512vl(auVar90);
        auVar293 = ZEXT3264(auVar102);
        auVar265._0_4_ = local_5c0._0_4_ * auVar260._0_4_;
        auVar265._4_4_ = local_5c0._4_4_ * auVar260._4_4_;
        auVar265._8_4_ = local_5c0._8_4_ * auVar260._8_4_;
        auVar265._12_4_ = local_5c0._12_4_ * auVar260._12_4_;
        auVar265._16_4_ = local_5c0._16_4_ * auVar260._16_4_;
        auVar265._20_4_ = local_5c0._20_4_ * auVar260._20_4_;
        auVar265._28_36_ = auVar260._28_36_;
        auVar265._24_4_ = local_5c0._24_4_ * auVar260._24_4_;
        auVar284 = ZEXT3264(local_5a0);
        auVar85 = vfmadd231ps_fma(auVar265._0_32_,local_5a0,auVar100);
        auVar265 = ZEXT3264(local_580);
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),local_580,auVar118);
        auVar259._8_4_ = 0x7fffffff;
        auVar259._0_8_ = 0x7fffffff7fffffff;
        auVar259._12_4_ = 0x7fffffff;
        auVar259._16_4_ = 0x7fffffff;
        auVar259._20_4_ = 0x7fffffff;
        auVar259._24_4_ = 0x7fffffff;
        auVar259._28_4_ = 0x7fffffff;
        auVar260 = ZEXT3264(auVar259);
        auVar102 = vandps_avx(ZEXT1632(auVar85),auVar259);
        auVar279 = ZEXT3264(auVar99);
        _local_1c0 = auVar99;
        auVar256._8_4_ = 0x3e99999a;
        auVar256._0_8_ = 0x3e99999a3e99999a;
        auVar256._12_4_ = 0x3e99999a;
        auVar256._16_4_ = 0x3e99999a;
        auVar256._20_4_ = 0x3e99999a;
        auVar256._24_4_ = 0x3e99999a;
        auVar256._28_4_ = 0x3e99999a;
        uVar19 = vcmpps_avx512vl(auVar102,auVar256,1);
        _local_540 = vmaxps_avx(auVar99,auVar136);
        _local_340 = _local_540;
        auVar102 = vminps_avx(local_320,auVar126);
        uVar21 = vcmpps_avx512vl(auVar99,auVar102,2);
        bVar56 = (byte)uVar21 & bVar51;
        uVar20 = vcmpps_avx512vl(_local_540,local_320,2);
        if ((bVar51 & ((byte)uVar20 | (byte)uVar21)) == 0) {
          auVar252 = ZEXT3264(auVar259);
        }
        else {
          bVar52 = (byte)uVar19 | ~bVar60;
          auVar44._4_4_ = local_5c0._4_4_ * auVar275._4_4_;
          auVar44._0_4_ = local_5c0._0_4_ * auVar275._0_4_;
          auVar44._8_4_ = local_5c0._8_4_ * auVar275._8_4_;
          auVar44._12_4_ = local_5c0._12_4_ * auVar275._12_4_;
          auVar44._16_4_ = local_5c0._16_4_ * auVar275._16_4_;
          auVar44._20_4_ = local_5c0._20_4_ * auVar275._20_4_;
          auVar44._24_4_ = local_5c0._24_4_ * auVar275._24_4_;
          auVar44._28_4_ = auVar102._28_4_;
          auVar85 = vfmadd213ps_fma(auVar119,local_5a0,auVar44);
          auVar85 = vfmadd213ps_fma(auVar117,local_580,ZEXT1632(auVar85));
          auVar102 = vandps_avx(ZEXT1632(auVar85),auVar259);
          uVar19 = vcmpps_avx512vl(auVar102,auVar256,1);
          bVar60 = (byte)uVar19 | ~bVar60;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar160,auVar31);
          local_300._0_4_ = (uint)(bVar60 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
          bVar62 = (bool)(bVar60 >> 1 & 1);
          local_300._4_4_ = (uint)bVar62 * auVar102._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 2 & 1);
          local_300._8_4_ = (uint)bVar62 * auVar102._8_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 3 & 1);
          local_300._12_4_ = (uint)bVar62 * auVar102._12_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 4 & 1);
          local_300._16_4_ = (uint)bVar62 * auVar102._16_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 5 & 1);
          local_300._20_4_ = (uint)bVar62 * auVar102._20_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar60 >> 6 & 1);
          local_300._24_4_ = (uint)bVar62 * auVar102._24_4_ | (uint)!bVar62 * 2;
          local_300._28_4_ = (uint)(bVar60 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
          local_4c0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_4c0,local_300,5);
          local_520 = auVar99._0_4_ + (float)local_560._0_4_;
          fStack_51c = auVar99._4_4_ + (float)local_560._4_4_;
          fStack_518 = auVar99._8_4_ + fStack_558;
          fStack_514 = auVar99._12_4_ + fStack_554;
          fStack_510 = auVar99._16_4_ + fStack_550;
          fStack_50c = auVar99._20_4_ + fStack_54c;
          fStack_508 = auVar99._24_4_ + fStack_548;
          fStack_504 = auVar99._28_4_ + fStack_544;
          for (bVar60 = (byte)uVar19 & bVar56; auVar102 = _local_340, bVar60 != 0;
              bVar60 = ~bVar58 & bVar60 & (byte)uVar19) {
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar102 = vblendmps_avx512vl(auVar161,auVar99);
            auVar137._0_4_ =
                 (uint)(bVar60 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar62 * auVar102._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar62 * auVar102._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar62 * auVar102._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar62 * auVar102._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar62 * auVar102._20_4_ | (uint)!bVar62 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar60 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar102 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar102 = vminps_avx(auVar137,auVar102);
            auVar100 = vshufpd_avx(auVar102,auVar102,5);
            auVar102 = vminps_avx(auVar102,auVar100);
            auVar100 = vpermpd_avx2(auVar102,0x4e);
            auVar102 = vminps_avx(auVar102,auVar100);
            uVar19 = vcmpps_avx512vl(auVar137,auVar102,0);
            bVar53 = (byte)uVar19 & bVar60;
            bVar58 = bVar60;
            if (bVar53 != 0) {
              bVar58 = bVar53;
            }
            iVar22 = 0;
            for (uVar64 = (uint)bVar58; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar58 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar64 = *(uint *)(local_1e0 + (uint)(iVar22 << 2));
            uVar140 = *(uint *)(local_1c0 + (uint)(iVar22 << 2));
            fVar261 = auVar83._0_4_;
            if ((float)local_7e0._0_4_ < 0.0) {
              auVar265 = ZEXT1664(auVar265._0_16_);
              auVar275 = ZEXT1664(auVar275._0_16_);
              auVar279 = ZEXT1664(auVar279._0_16_);
              auVar284 = ZEXT1664(auVar284._0_16_);
              fVar261 = sqrtf((float)local_7e0._0_4_);
              auVar102 = vmovdqa64_avx512vl(auVar90);
              auVar293 = ZEXT3264(auVar102);
              auVar102 = vmovdqa64_avx512vl(auVar89);
              auVar292 = ZEXT3264(auVar102);
              auVar102 = vmovdqa64_avx512vl(auVar88);
              auVar291 = ZEXT3264(auVar102);
            }
            auVar260 = ZEXT464(uVar140);
            uVar63 = (ulong)bVar58;
            auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar3 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar69 = vminps_avx(auVar78,auVar3);
            auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar3 = vmaxps_avx(auVar85,auVar78);
            auVar220._8_4_ = 0x7fffffff;
            auVar220._0_8_ = 0x7fffffff7fffffff;
            auVar220._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar69,auVar220);
            auVar78 = vandps_avx(auVar3,auVar220);
            auVar85 = vmaxps_avx(auVar85,auVar78);
            auVar78 = vmovshdup_avx(auVar85);
            auVar78 = vmaxss_avx(auVar78,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar78);
            fVar266 = auVar85._0_4_ * 1.9073486e-06;
            local_6c0 = vshufps_avx(auVar3,auVar3,0xff);
            auVar85 = vinsertps_avx(ZEXT416(uVar140),ZEXT416(uVar64),0x10);
            auVar272 = ZEXT1664(auVar85);
            uVar59 = 0;
            while( true ) {
              bVar53 = (byte)uVar63;
              if (uVar59 == 5) break;
              uVar172 = auVar272._0_4_;
              auVar152._4_4_ = uVar172;
              auVar152._0_4_ = uVar172;
              auVar152._8_4_ = uVar172;
              auVar152._12_4_ = uVar172;
              auVar85 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_7d0);
              local_720 = auVar272._0_32_;
              auVar78 = vmovshdup_avx(auVar272._0_16_);
              fVar244 = auVar78._0_4_;
              fVar245 = 1.0 - fVar244;
              fVar268 = fVar245 * fVar245 * fVar245;
              fVar237 = fVar244 * fVar244 * fVar244;
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar268),
                                       ZEXT416((uint)fVar237));
              fVar267 = fVar244 * fVar245;
              auVar72 = ZEXT416((uint)fVar245);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar244 * 6.0)),
                                        ZEXT416((uint)(fVar267 * fVar245)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                        ZEXT416((uint)fVar268));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar245 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar267 * fVar244)));
              fVar268 = fVar268 * 0.16666667;
              fVar235 = (auVar3._0_4_ + auVar75._0_4_) * 0.16666667;
              fVar236 = (auVar69._0_4_ + auVar71._0_4_) * 0.16666667;
              fVar237 = fVar237 * 0.16666667;
              auVar194._0_4_ = fVar237 * (float)local_7c0._0_4_;
              auVar194._4_4_ = fVar237 * (float)local_7c0._4_4_;
              auVar194._8_4_ = fVar237 * fStack_7b8;
              auVar194._12_4_ = fVar237 * fStack_7b4;
              auVar239._4_4_ = fVar236;
              auVar239._0_4_ = fVar236;
              auVar239._8_4_ = fVar236;
              auVar239._12_4_ = fVar236;
              auVar3 = vfmadd132ps_fma(auVar239,auVar194,local_780._0_16_);
              auVar195._4_4_ = fVar235;
              auVar195._0_4_ = fVar235;
              auVar195._8_4_ = fVar235;
              auVar195._12_4_ = fVar235;
              auVar3 = vfmadd132ps_fma(auVar195,auVar3,local_7a0._0_16_);
              auVar176._4_4_ = fVar268;
              auVar176._0_4_ = fVar268;
              auVar176._8_4_ = fVar268;
              auVar176._12_4_ = fVar268;
              auVar3 = vfmadd132ps_fma(auVar176,auVar3,local_760._0_16_);
              local_5e0._0_16_ = auVar3;
              auVar3 = vsubps_avx(auVar85,auVar3);
              auVar85 = vdpps_avx(auVar3,auVar3,0x7f);
              local_800._0_16_ = auVar85;
              if (auVar85._0_4_ < 0.0) {
                auVar252._0_4_ = sqrtf(auVar85._0_4_);
                auVar252._4_60_ = extraout_var;
                auVar85 = auVar252._0_16_;
                uVar63 = extraout_RAX;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
              }
              local_600._4_4_ = fVar245;
              local_600._0_4_ = fVar245;
              fStack_5f8 = fVar245;
              fStack_5f4 = fVar245;
              auVar75 = vfnmsub213ss_fma(auVar78,auVar78,ZEXT416((uint)(fVar267 * 4.0)));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * 4.0)),auVar72,auVar72);
              fVar267 = fVar245 * -fVar245 * 0.5;
              fVar268 = auVar75._0_4_ * 0.5;
              fVar235 = auVar69._0_4_ * 0.5;
              fVar236 = fVar244 * fVar244 * 0.5;
              auVar221._0_4_ = fVar236 * (float)local_7c0._0_4_;
              auVar221._4_4_ = fVar236 * (float)local_7c0._4_4_;
              auVar221._8_4_ = fVar236 * fStack_7b8;
              auVar221._12_4_ = fVar236 * fStack_7b4;
              auVar177._4_4_ = fVar235;
              auVar177._0_4_ = fVar235;
              auVar177._8_4_ = fVar235;
              auVar177._12_4_ = fVar235;
              auVar69 = vfmadd132ps_fma(auVar177,auVar221,local_780._0_16_);
              auVar196._4_4_ = fVar268;
              auVar196._0_4_ = fVar268;
              auVar196._8_4_ = fVar268;
              auVar196._12_4_ = fVar268;
              auVar69 = vfmadd132ps_fma(auVar196,auVar69,local_7a0._0_16_);
              auVar281._4_4_ = fVar267;
              auVar281._0_4_ = fVar267;
              auVar281._8_4_ = fVar267;
              auVar281._12_4_ = fVar267;
              auVar69 = vfmadd132ps_fma(auVar281,auVar69,local_760._0_16_);
              local_620._0_16_ = vdpps_avx(auVar69,auVar69,0x7f);
              auVar46._12_4_ = 0;
              auVar46._0_12_ = ZEXT812(0);
              fVar267 = local_620._0_4_;
              local_740._0_16_ = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar267));
              fVar268 = local_740._0_4_;
              local_640._0_16_ = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar267));
              auVar75 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar75._0_4_;
              uVar64 = auVar85._0_4_;
              if (fVar267 < -fVar267) {
                fVar235 = sqrtf(fVar267);
                auVar85 = ZEXT416(uVar64);
                uVar63 = extraout_RAX_00;
              }
              else {
                auVar75 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                fVar235 = auVar75._0_4_;
              }
              fVar236 = local_740._0_4_;
              fVar267 = fVar268 * 1.5 + fVar267 * -0.5 * fVar236 * fVar236 * fVar236;
              local_740._0_4_ = auVar69._0_4_ * fVar267;
              local_740._4_4_ = auVar69._4_4_ * fVar267;
              local_740._8_4_ = auVar69._8_4_ * fVar267;
              local_740._12_4_ = auVar69._12_4_ * fVar267;
              auVar75 = vdpps_avx(auVar3,local_740._0_16_,0x7f);
              fVar237 = auVar85._0_4_;
              fVar268 = auVar75._0_4_;
              auVar153._0_4_ = fVar268 * fVar268;
              auVar153._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar153._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar153._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar71 = vsubps_avx(local_800._0_16_,auVar153);
              fVar236 = auVar71._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar236;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar74 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              if (fVar236 < 0.0) {
                local_680._0_4_ = fVar235;
                local_6a0._0_4_ = auVar74._0_4_;
                local_6b0._4_4_ = fVar267;
                local_6b0._0_4_ = fVar267;
                fStack_6a8 = fVar267;
                fStack_6a4 = fVar267;
                local_690 = auVar73;
                fVar236 = sqrtf(fVar236);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar74 = ZEXT416((uint)local_6a0._0_4_);
                auVar85 = ZEXT416(uVar64);
                uVar63 = extraout_RAX_01;
                auVar73 = local_690;
                fVar267 = (float)local_6b0._0_4_;
                fVar245 = (float)local_6b0._4_4_;
                fVar244 = fStack_6a8;
                fVar290 = fStack_6a4;
                fVar235 = (float)local_680._0_4_;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar236 = auVar71._0_4_;
                fVar245 = fVar267;
                fVar244 = fVar267;
                fVar290 = fVar267;
              }
              auVar284 = ZEXT1664(auVar69);
              auVar279 = ZEXT1664(local_800._0_16_);
              auVar275 = ZEXT1664(auVar3);
              auVar102 = vmovdqa64_avx512vl(auVar88);
              auVar291 = ZEXT3264(auVar102);
              auVar102 = vmovdqa64_avx512vl(auVar89);
              auVar292 = ZEXT3264(auVar102);
              auVar102 = vmovdqa64_avx512vl(auVar90);
              auVar293 = ZEXT3264(auVar102);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar72,auVar78);
              auVar72 = vfmadd213ss_fma(auVar78,SUB6416(ZEXT464(0xc0000000),0),auVar72);
              auVar79 = local_720._0_16_;
              auVar78 = vshufps_avx(auVar79,auVar79,0x55);
              auVar197._0_4_ = auVar78._0_4_ * (float)local_7c0._0_4_;
              auVar197._4_4_ = auVar78._4_4_ * (float)local_7c0._4_4_;
              auVar197._8_4_ = auVar78._8_4_ * fStack_7b8;
              auVar197._12_4_ = auVar78._12_4_ * fStack_7b4;
              auVar222._0_4_ = auVar72._0_4_;
              auVar222._4_4_ = auVar222._0_4_;
              auVar222._8_4_ = auVar222._0_4_;
              auVar222._12_4_ = auVar222._0_4_;
              auVar78 = vfmadd132ps_fma(auVar222,auVar197,local_780._0_16_);
              auVar179._0_4_ = auVar71._0_4_;
              auVar179._4_4_ = auVar179._0_4_;
              auVar179._8_4_ = auVar179._0_4_;
              auVar179._12_4_ = auVar179._0_4_;
              auVar78 = vfmadd132ps_fma(auVar179,auVar78,local_7a0._0_16_);
              auVar78 = vfmadd132ps_fma(_local_600,auVar78,local_760._0_16_);
              auVar180._0_4_ = auVar78._0_4_ * (float)local_620._0_4_;
              auVar180._4_4_ = auVar78._4_4_ * (float)local_620._0_4_;
              auVar180._8_4_ = auVar78._8_4_ * (float)local_620._0_4_;
              auVar180._12_4_ = auVar78._12_4_ * (float)local_620._0_4_;
              auVar78 = vdpps_avx(auVar69,auVar78,0x7f);
              fVar192 = auVar78._0_4_;
              auVar198._0_4_ = auVar69._0_4_ * fVar192;
              auVar198._4_4_ = auVar69._4_4_ * fVar192;
              auVar198._8_4_ = auVar69._8_4_ * fVar192;
              auVar198._12_4_ = auVar69._12_4_ * fVar192;
              auVar78 = vsubps_avx(auVar180,auVar198);
              fVar192 = (float)local_660._0_4_ * (float)local_640._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)fVar266),
                                   ZEXT416((uint)(local_720._0_4_ * fVar261 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar69,auVar23);
              auVar199._0_4_ = fVar267 * auVar78._0_4_ * fVar192;
              auVar199._4_4_ = fVar245 * auVar78._4_4_ * fVar192;
              auVar199._8_4_ = fVar244 * auVar78._8_4_ * fVar192;
              auVar199._12_4_ = fVar290 * auVar78._12_4_ * fVar192;
              auVar78 = vdpps_avx(auVar86,local_740._0_16_,0x7f);
              auVar71 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar266),auVar72);
              auVar85 = vdpps_avx(auVar3,auVar199,0x7f);
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),
                                        ZEXT416((uint)(fVar266 / fVar235)),auVar71);
              fVar267 = auVar78._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_7d0,local_740._0_16_,0x7f);
              auVar78 = vdpps_avx(auVar3,auVar86,0x7f);
              auVar71 = vmulss_avx512f(auVar76,auVar73);
              auVar76 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar71._0_4_ *
                                                             auVar73._0_4_ * auVar73._0_4_)));
              auVar71 = vdpps_avx(auVar3,local_7d0,0x7f);
              auVar74 = vfnmadd231ss_fma(auVar78,auVar75,ZEXT416((uint)fVar267));
              auVar71 = vfnmadd231ss_fma(auVar71,auVar75,auVar85);
              auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar236 = fVar236 - auVar78._0_4_;
              auVar73 = vshufps_avx(auVar69,auVar69,0xff);
              auVar78 = vfmsub213ss_fma(auVar74,auVar76,auVar73);
              auVar262._8_4_ = 0x80000000;
              auVar262._0_8_ = 0x8000000080000000;
              auVar262._12_4_ = 0x80000000;
              auVar265 = ZEXT1664(auVar262);
              auVar257._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar257._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar257._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar260 = ZEXT1664(auVar257);
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * auVar76._0_4_));
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar267),auVar71);
              auVar78 = vinsertps_avx(auVar257,auVar71,0x1c);
              auVar248._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar248._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar248._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar267),auVar248,0x10);
              auVar223._0_4_ = auVar74._0_4_;
              auVar223._4_4_ = auVar223._0_4_;
              auVar223._8_4_ = auVar223._0_4_;
              auVar223._12_4_ = auVar223._0_4_;
              auVar85 = vdivps_avx(auVar78,auVar223);
              auVar78 = vdivps_avx(auVar71,auVar223);
              auVar224._0_4_ = fVar268 * auVar85._0_4_ + fVar236 * auVar78._0_4_;
              auVar224._4_4_ = fVar268 * auVar85._4_4_ + fVar236 * auVar78._4_4_;
              auVar224._8_4_ = fVar268 * auVar85._8_4_ + fVar236 * auVar78._8_4_;
              auVar224._12_4_ = fVar268 * auVar85._12_4_ + fVar236 * auVar78._12_4_;
              auVar85 = vsubps_avx(auVar79,auVar224);
              auVar272 = ZEXT1664(auVar85);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx512vl(auVar75,auVar24);
              if (auVar78._0_4_ < auVar77._0_4_) {
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ + auVar72._0_4_)),local_6c0,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar236),auVar25);
                if (auVar75._0_4_ < auVar78._0_4_) {
                  bVar62 = uVar59 < 5;
                  fVar261 = auVar85._0_4_ + (float)local_6d0._0_4_;
                  if ((fVar2 <= fVar261) &&
                     (fVar266 = *(float *)(ray + k * 4 + 0x100), fVar261 <= fVar266)) {
                    auVar78 = vmovshdup_avx(auVar85);
                    bVar53 = 0;
                    if ((auVar78._0_4_ < 0.0) || (1.0 < auVar78._0_4_)) goto LAB_018d9653;
                    auVar225._0_12_ = ZEXT812(0);
                    auVar225._12_4_ = 0;
                    auVar200._4_8_ = auVar225._4_8_;
                    auVar200._0_4_ = local_800._0_4_;
                    auVar200._12_4_ = 0;
                    auVar78 = vrsqrt14ss_avx512f(auVar225,auVar200);
                    fVar267 = auVar78._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar53 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018d9653;
                      fVar267 = fVar267 * 1.5 + local_800._0_4_ * -0.5 * fVar267 * fVar267 * fVar267
                      ;
                      auVar201._0_4_ = auVar3._0_4_ * fVar267;
                      auVar201._4_4_ = auVar3._4_4_ * fVar267;
                      auVar201._8_4_ = auVar3._8_4_ * fVar267;
                      auVar201._12_4_ = auVar3._12_4_ * fVar267;
                      auVar72 = vfmadd213ps_fma(auVar73,auVar201,auVar69);
                      auVar78 = vshufps_avx(auVar201,auVar201,0xc9);
                      auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar202._0_4_ = auVar201._0_4_ * auVar75._0_4_;
                      auVar202._4_4_ = auVar201._4_4_ * auVar75._4_4_;
                      auVar202._8_4_ = auVar201._8_4_ * auVar75._8_4_;
                      auVar202._12_4_ = auVar201._12_4_ * auVar75._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar202,auVar69,auVar78);
                      auVar78 = vshufps_avx(auVar71,auVar71,0xc9);
                      auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                      auVar154._0_4_ = auVar72._0_4_ * auVar71._0_4_;
                      auVar154._4_4_ = auVar72._4_4_ * auVar71._4_4_;
                      auVar154._8_4_ = auVar72._8_4_ * auVar71._8_4_;
                      auVar154._12_4_ = auVar72._12_4_ * auVar71._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar154,auVar78,auVar75);
                      auVar232._8_4_ = 1;
                      auVar232._0_8_ = 0x100000001;
                      auVar232._12_4_ = 1;
                      auVar232._16_4_ = 1;
                      auVar232._20_4_ = 1;
                      auVar232._24_4_ = 1;
                      auVar232._28_4_ = 1;
                      local_400 = vpermps_avx2(auVar232,ZEXT1632(auVar85));
                      auVar102 = vpermps_avx2(auVar232,ZEXT1632(auVar78));
                      auVar242._8_4_ = 2;
                      auVar242._0_8_ = 0x200000002;
                      auVar242._12_4_ = 2;
                      auVar242._16_4_ = 2;
                      auVar242._20_4_ = 2;
                      auVar242._24_4_ = 2;
                      auVar242._28_4_ = 2;
                      local_440 = vpermps_avx2(auVar242,ZEXT1632(auVar78));
                      local_420 = auVar78._0_4_;
                      local_460[0] = (RTCHitN)auVar102[0];
                      local_460[1] = (RTCHitN)auVar102[1];
                      local_460[2] = (RTCHitN)auVar102[2];
                      local_460[3] = (RTCHitN)auVar102[3];
                      local_460[4] = (RTCHitN)auVar102[4];
                      local_460[5] = (RTCHitN)auVar102[5];
                      local_460[6] = (RTCHitN)auVar102[6];
                      local_460[7] = (RTCHitN)auVar102[7];
                      local_460[8] = (RTCHitN)auVar102[8];
                      local_460[9] = (RTCHitN)auVar102[9];
                      local_460[10] = (RTCHitN)auVar102[10];
                      local_460[0xb] = (RTCHitN)auVar102[0xb];
                      local_460[0xc] = (RTCHitN)auVar102[0xc];
                      local_460[0xd] = (RTCHitN)auVar102[0xd];
                      local_460[0xe] = (RTCHitN)auVar102[0xe];
                      local_460[0xf] = (RTCHitN)auVar102[0xf];
                      local_460[0x10] = (RTCHitN)auVar102[0x10];
                      local_460[0x11] = (RTCHitN)auVar102[0x11];
                      local_460[0x12] = (RTCHitN)auVar102[0x12];
                      local_460[0x13] = (RTCHitN)auVar102[0x13];
                      local_460[0x14] = (RTCHitN)auVar102[0x14];
                      local_460[0x15] = (RTCHitN)auVar102[0x15];
                      local_460[0x16] = (RTCHitN)auVar102[0x16];
                      local_460[0x17] = (RTCHitN)auVar102[0x17];
                      local_460[0x18] = (RTCHitN)auVar102[0x18];
                      local_460[0x19] = (RTCHitN)auVar102[0x19];
                      local_460[0x1a] = (RTCHitN)auVar102[0x1a];
                      local_460[0x1b] = (RTCHitN)auVar102[0x1b];
                      local_460[0x1c] = (RTCHitN)auVar102[0x1c];
                      local_460[0x1d] = (RTCHitN)auVar102[0x1d];
                      local_460[0x1e] = (RTCHitN)auVar102[0x1e];
                      local_460[0x1f] = (RTCHitN)auVar102[0x1f];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      local_3e0 = ZEXT432(0) << 0x20;
                      local_3c0 = local_480._0_8_;
                      uStack_3b8 = local_480._8_8_;
                      uStack_3b0 = local_480._16_8_;
                      uStack_3a8 = local_480._24_8_;
                      local_3a0 = local_4a0;
                      vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_380 = context->user->instID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      local_360 = context->user->instPrimID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      *(float *)(ray + k * 4 + 0x100) = fVar261;
                      local_700 = local_4e0;
                      local_830.valid = (int *)local_700;
                      local_830.geometryUserPtr = pGVar5->userPtr;
                      local_830.context = context->user;
                      local_830.hit = local_460;
                      local_830.N = 8;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar260 = ZEXT1664(auVar257);
                        auVar265 = ZEXT1664(auVar262);
                        auVar272 = ZEXT1664(auVar85);
                        auVar275 = ZEXT1664(auVar3);
                        auVar279 = ZEXT1664(local_800._0_16_);
                        auVar284 = ZEXT1664(auVar69);
                        (*pGVar5->occlusionFilterN)(&local_830);
                        auVar102 = vmovdqa64_avx512vl(auVar90);
                        auVar293 = ZEXT3264(auVar102);
                        auVar102 = vmovdqa64_avx512vl(auVar89);
                        auVar292 = ZEXT3264(auVar102);
                        auVar102 = vmovdqa64_avx512vl(auVar88);
                        auVar291 = ZEXT3264(auVar102);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar260 = ZEXT1664(auVar260._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          auVar284 = ZEXT1664(auVar284._0_16_);
                          (*p_Var9)(&local_830);
                          auVar102 = vmovdqa64_avx512vl(auVar90);
                          auVar293 = ZEXT3264(auVar102);
                          auVar102 = vmovdqa64_avx512vl(auVar89);
                          auVar292 = ZEXT3264(auVar102);
                          auVar102 = vmovdqa64_avx512vl(auVar88);
                          auVar291 = ZEXT3264(auVar102);
                        }
                        uVar63 = vptestmd_avx512vl(local_700,local_700);
                        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar63 & 1);
                        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar63 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar63 >> 6) & 1);
                        bVar17 = SUB81(uVar63 >> 7,0);
                        *(uint *)(local_830.ray + 0x100) =
                             (uint)bVar10 * auVar102._0_4_ |
                             (uint)!bVar10 * *(int *)(local_830.ray + 0x100);
                        *(uint *)(local_830.ray + 0x104) =
                             (uint)bVar11 * auVar102._4_4_ |
                             (uint)!bVar11 * *(int *)(local_830.ray + 0x104);
                        *(uint *)(local_830.ray + 0x108) =
                             (uint)bVar12 * auVar102._8_4_ |
                             (uint)!bVar12 * *(int *)(local_830.ray + 0x108);
                        *(uint *)(local_830.ray + 0x10c) =
                             (uint)bVar13 * auVar102._12_4_ |
                             (uint)!bVar13 * *(int *)(local_830.ray + 0x10c);
                        *(uint *)(local_830.ray + 0x110) =
                             (uint)bVar14 * auVar102._16_4_ |
                             (uint)!bVar14 * *(int *)(local_830.ray + 0x110);
                        *(uint *)(local_830.ray + 0x114) =
                             (uint)bVar15 * auVar102._20_4_ |
                             (uint)!bVar15 * *(int *)(local_830.ray + 0x114);
                        *(uint *)(local_830.ray + 0x118) =
                             (uint)bVar16 * auVar102._24_4_ |
                             (uint)!bVar16 * *(int *)(local_830.ray + 0x118);
                        *(uint *)(local_830.ray + 0x11c) =
                             (uint)bVar17 * auVar102._28_4_ |
                             (uint)!bVar17 * *(int *)(local_830.ray + 0x11c);
                        bVar53 = 1;
                        if (local_700 != (undefined1  [32])0x0) goto LAB_018d9653;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar266;
                      bVar53 = 0;
                      goto LAB_018d9653;
                    }
                  }
                  bVar53 = 0;
                  goto LAB_018d9653;
                }
              }
              uVar59 = uVar59 + 1;
            }
            bVar62 = false;
LAB_018d9653:
            bVar54 = bVar54 | bVar62 & bVar53;
            uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar250._4_4_ = uVar172;
            auVar250._0_4_ = uVar172;
            auVar250._8_4_ = uVar172;
            auVar250._12_4_ = uVar172;
            auVar250._16_4_ = uVar172;
            auVar250._20_4_ = uVar172;
            auVar250._24_4_ = uVar172;
            auVar250._28_4_ = uVar172;
            auVar252 = ZEXT3264(auVar250);
            auVar48._4_4_ = fStack_51c;
            auVar48._0_4_ = local_520;
            auVar48._8_4_ = fStack_518;
            auVar48._12_4_ = fStack_514;
            auVar48._16_4_ = fStack_510;
            auVar48._20_4_ = fStack_50c;
            auVar48._24_4_ = fStack_508;
            auVar48._28_4_ = fStack_504;
            uVar19 = vcmpps_avx512vl(auVar250,auVar48,0xd);
          }
          auVar162._0_4_ = (float)local_560._0_4_ + (float)local_540._0_4_;
          auVar162._4_4_ = (float)local_560._4_4_ + (float)local_540._4_4_;
          auVar162._8_4_ = fStack_558 + fStack_538;
          auVar162._12_4_ = fStack_554 + fStack_534;
          auVar162._16_4_ = fStack_550 + fStack_530;
          auVar162._20_4_ = fStack_54c + fStack_52c;
          auVar162._24_4_ = fStack_548 + fStack_528;
          auVar162._28_4_ = fStack_544 + fStack_524;
          uVar172 = auVar252._0_4_;
          auVar187._4_4_ = uVar172;
          auVar187._0_4_ = uVar172;
          auVar187._8_4_ = uVar172;
          auVar187._12_4_ = uVar172;
          auVar187._16_4_ = uVar172;
          auVar187._20_4_ = uVar172;
          auVar187._24_4_ = uVar172;
          auVar187._28_4_ = uVar172;
          uVar19 = vcmpps_avx512vl(auVar162,auVar187,2);
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar99 = vpblendmd_avx512vl(auVar163,auVar32);
          local_540._0_4_ = (uint)(bVar52 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
          bVar62 = (bool)(bVar52 >> 1 & 1);
          local_540._4_4_ = (uint)bVar62 * auVar99._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar52 >> 2 & 1);
          fStack_538 = (float)((uint)bVar62 * auVar99._8_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 3 & 1);
          fStack_534 = (float)((uint)bVar62 * auVar99._12_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 4 & 1);
          fStack_530 = (float)((uint)bVar62 * auVar99._16_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 5 & 1);
          fStack_52c = (float)((uint)bVar62 * auVar99._20_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 6 & 1);
          fStack_528 = (float)((uint)bVar62 * auVar99._24_4_ | (uint)!bVar62 * 2);
          fStack_524 = (float)((uint)(bVar52 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2
                              );
          bVar51 = (byte)uVar20 & bVar51 & (byte)uVar19;
          uVar19 = vpcmpd_avx512vl(_local_540,local_4c0,2);
          local_520 = (float)local_560._0_4_ + (float)local_340._0_4_;
          fStack_51c = (float)local_560._4_4_ + (float)local_340._4_4_;
          fStack_518 = fStack_558 + fStack_338;
          fStack_514 = fStack_554 + fStack_334;
          fStack_510 = fStack_550 + fStack_330;
          fStack_50c = fStack_54c + fStack_32c;
          fStack_508 = fStack_548 + fStack_328;
          fStack_504 = fStack_544 + fStack_324;
          for (bVar60 = (byte)uVar19 & bVar51; bVar60 != 0; bVar60 = ~bVar52 & bVar60 & (byte)uVar19
              ) {
            auVar164._8_4_ = 0x7f800000;
            auVar164._0_8_ = 0x7f8000007f800000;
            auVar164._12_4_ = 0x7f800000;
            auVar164._16_4_ = 0x7f800000;
            auVar164._20_4_ = 0x7f800000;
            auVar164._24_4_ = 0x7f800000;
            auVar164._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar164,auVar102);
            auVar138._0_4_ =
                 (uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar62 * auVar99._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar62 * auVar99._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar62 * auVar99._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar62 * auVar99._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar60 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar62 * auVar99._20_4_ | (uint)!bVar62 * 0x7f800000;
            auVar138._24_4_ =
                 (uint)(bVar60 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar99 = vminps_avx(auVar138,auVar99);
            auVar100 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar100);
            auVar100 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar100);
            uVar19 = vcmpps_avx512vl(auVar138,auVar99,0);
            bVar58 = (byte)uVar19 & bVar60;
            bVar52 = bVar60;
            if (bVar58 != 0) {
              bVar52 = bVar58;
            }
            iVar22 = 0;
            for (uVar64 = (uint)bVar52; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            bVar52 = '\x01' << ((byte)iVar22 & 0x1f);
            uVar64 = *(uint *)(local_200 + (uint)(iVar22 << 2));
            uVar140 = *(uint *)(local_320 + (uint)(iVar22 << 2));
            fVar261 = auVar84._0_4_;
            if ((float)local_7e0._0_4_ < 0.0) {
              auVar265 = ZEXT1664(auVar265._0_16_);
              auVar275 = ZEXT1664(auVar275._0_16_);
              auVar279 = ZEXT1664(auVar279._0_16_);
              auVar284 = ZEXT1664(auVar284._0_16_);
              fVar261 = sqrtf((float)local_7e0._0_4_);
              auVar99 = vmovdqa64_avx512vl(auVar90);
              auVar293 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar89);
              auVar292 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar88);
              auVar291 = ZEXT3264(auVar99);
            }
            auVar260 = ZEXT464(uVar140);
            uVar63 = (ulong)bVar52;
            auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar3 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar69 = vminps_avx(auVar78,auVar3);
            auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar3 = vmaxps_avx(auVar85,auVar78);
            auVar226._8_4_ = 0x7fffffff;
            auVar226._0_8_ = 0x7fffffff7fffffff;
            auVar226._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar69,auVar226);
            auVar78 = vandps_avx(auVar3,auVar226);
            auVar85 = vmaxps_avx(auVar85,auVar78);
            auVar78 = vmovshdup_avx(auVar85);
            auVar78 = vmaxss_avx(auVar78,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar78);
            local_740._0_4_ = auVar85._0_4_ * 1.9073486e-06;
            local_6c0 = vshufps_avx(auVar3,auVar3,0xff);
            auVar85 = vinsertps_avx(ZEXT416(uVar140),ZEXT416(uVar64),0x10);
            auVar272 = ZEXT1664(auVar85);
            uVar59 = 0;
            while( true ) {
              bVar58 = (byte)uVar63;
              if (uVar59 == 5) break;
              uVar172 = auVar272._0_4_;
              auVar155._4_4_ = uVar172;
              auVar155._0_4_ = uVar172;
              auVar155._8_4_ = uVar172;
              auVar155._12_4_ = uVar172;
              auVar85 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_7d0);
              local_720 = auVar272._0_32_;
              auVar78 = vmovshdup_avx(auVar272._0_16_);
              fVar245 = auVar78._0_4_;
              fVar237 = 1.0 - fVar245;
              fVar267 = fVar237 * fVar237 * fVar237;
              fVar236 = fVar245 * fVar245 * fVar245;
              auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                       ZEXT416((uint)fVar236));
              fVar266 = fVar245 * fVar237;
              auVar72 = ZEXT416((uint)fVar237);
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * fVar245 * 6.0)),
                                        ZEXT416((uint)(fVar266 * fVar237)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                        ZEXT416((uint)fVar267));
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * fVar237 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar266 * fVar245)));
              fVar267 = fVar267 * 0.16666667;
              fVar268 = (auVar3._0_4_ + auVar75._0_4_) * 0.16666667;
              fVar235 = (auVar69._0_4_ + auVar71._0_4_) * 0.16666667;
              fVar236 = fVar236 * 0.16666667;
              auVar203._0_4_ = fVar236 * (float)local_7c0._0_4_;
              auVar203._4_4_ = fVar236 * (float)local_7c0._4_4_;
              auVar203._8_4_ = fVar236 * fStack_7b8;
              auVar203._12_4_ = fVar236 * fStack_7b4;
              auVar240._4_4_ = fVar235;
              auVar240._0_4_ = fVar235;
              auVar240._8_4_ = fVar235;
              auVar240._12_4_ = fVar235;
              auVar3 = vfmadd132ps_fma(auVar240,auVar203,local_780._0_16_);
              auVar204._4_4_ = fVar268;
              auVar204._0_4_ = fVar268;
              auVar204._8_4_ = fVar268;
              auVar204._12_4_ = fVar268;
              auVar3 = vfmadd132ps_fma(auVar204,auVar3,local_7a0._0_16_);
              auVar181._4_4_ = fVar267;
              auVar181._0_4_ = fVar267;
              auVar181._8_4_ = fVar267;
              auVar181._12_4_ = fVar267;
              auVar3 = vfmadd132ps_fma(auVar181,auVar3,local_760._0_16_);
              local_5e0._0_16_ = auVar3;
              auVar3 = vsubps_avx(auVar85,auVar3);
              auVar85 = vdpps_avx(auVar3,auVar3,0x7f);
              local_800._0_16_ = auVar85;
              if (auVar85._0_4_ < 0.0) {
                auVar260._0_4_ = sqrtf(auVar85._0_4_);
                auVar260._4_60_ = extraout_var_00;
                auVar85 = auVar260._0_16_;
                uVar63 = extraout_RAX_02;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
              }
              local_600._4_4_ = fVar237;
              local_600._0_4_ = fVar237;
              fStack_5f8 = fVar237;
              fStack_5f4 = fVar237;
              auVar75 = vfnmsub213ss_fma(auVar78,auVar78,ZEXT416((uint)(fVar266 * 4.0)));
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * 4.0)),auVar72,auVar72);
              fVar266 = fVar237 * -fVar237 * 0.5;
              fVar267 = auVar75._0_4_ * 0.5;
              fVar268 = auVar69._0_4_ * 0.5;
              fVar235 = fVar245 * fVar245 * 0.5;
              auVar227._0_4_ = fVar235 * (float)local_7c0._0_4_;
              auVar227._4_4_ = fVar235 * (float)local_7c0._4_4_;
              auVar227._8_4_ = fVar235 * fStack_7b8;
              auVar227._12_4_ = fVar235 * fStack_7b4;
              auVar182._4_4_ = fVar268;
              auVar182._0_4_ = fVar268;
              auVar182._8_4_ = fVar268;
              auVar182._12_4_ = fVar268;
              auVar69 = vfmadd132ps_fma(auVar182,auVar227,local_780._0_16_);
              auVar205._4_4_ = fVar267;
              auVar205._0_4_ = fVar267;
              auVar205._8_4_ = fVar267;
              auVar205._12_4_ = fVar267;
              auVar69 = vfmadd132ps_fma(auVar205,auVar69,local_7a0._0_16_);
              auVar282._4_4_ = fVar266;
              auVar282._0_4_ = fVar266;
              auVar282._8_4_ = fVar266;
              auVar282._12_4_ = fVar266;
              auVar69 = vfmadd132ps_fma(auVar282,auVar69,local_760._0_16_);
              local_620._0_16_ = vdpps_avx(auVar69,auVar69,0x7f);
              auVar47._12_4_ = 0;
              auVar47._0_12_ = ZEXT812(0);
              fVar266 = local_620._0_4_;
              auVar75 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar266));
              fVar267 = auVar75._0_4_;
              local_640._0_16_ = vrcp14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar266));
              auVar75 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar75._0_4_;
              uVar64 = auVar85._0_4_;
              if (fVar266 < -fVar266) {
                fVar268 = sqrtf(fVar266);
                auVar85 = ZEXT416(uVar64);
                uVar63 = extraout_RAX_03;
              }
              else {
                auVar75 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                fVar268 = auVar75._0_4_;
              }
              auVar76 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar267 * 1.5 +
                                                 fVar266 * -0.5 * fVar267 * fVar267 * fVar267)));
              auVar74 = vmulps_avx512vl(auVar69,auVar76);
              auVar75 = vdpps_avx(auVar3,auVar74,0x7f);
              fVar235 = auVar85._0_4_;
              fVar266 = auVar75._0_4_;
              auVar156._0_4_ = fVar266 * fVar266;
              auVar156._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar156._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar156._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar71 = vsubps_avx(local_800._0_16_,auVar156);
              fVar267 = auVar71._0_4_;
              auVar183._4_12_ = ZEXT812(0) << 0x20;
              auVar183._0_4_ = fVar267;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
              auVar77 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              auVar86 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              if (fVar267 < 0.0) {
                local_690._0_4_ = auVar77._0_4_;
                _local_6b0 = auVar76;
                local_6a0 = auVar74;
                local_680 = auVar73;
                fVar267 = sqrtf(fVar267);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar77 = ZEXT416((uint)local_690._0_4_);
                auVar85 = ZEXT416(uVar64);
                uVar63 = extraout_RAX_04;
                auVar73 = local_680;
                auVar74 = local_6a0;
                auVar76 = _local_6b0;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar267 = auVar71._0_4_;
              }
              auVar284 = ZEXT1664(auVar69);
              auVar279 = ZEXT1664(local_800._0_16_);
              auVar275 = ZEXT1664(auVar3);
              auVar99 = vmovdqa64_avx512vl(auVar88);
              auVar291 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar89);
              auVar292 = ZEXT3264(auVar99);
              auVar99 = vmovdqa64_avx512vl(auVar90);
              auVar293 = ZEXT3264(auVar99);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar72,auVar78);
              auVar72 = vfmadd213ss_fma(auVar78,SUB6416(ZEXT464(0xc0000000),0),auVar72);
              auVar271 = local_720._0_16_;
              auVar78 = vshufps_avx(auVar271,auVar271,0x55);
              auVar206._0_4_ = auVar78._0_4_ * (float)local_7c0._0_4_;
              auVar206._4_4_ = auVar78._4_4_ * (float)local_7c0._4_4_;
              auVar206._8_4_ = auVar78._8_4_ * fStack_7b8;
              auVar206._12_4_ = auVar78._12_4_ * fStack_7b4;
              auVar228._0_4_ = auVar72._0_4_;
              auVar228._4_4_ = auVar228._0_4_;
              auVar228._8_4_ = auVar228._0_4_;
              auVar228._12_4_ = auVar228._0_4_;
              auVar78 = vfmadd132ps_fma(auVar228,auVar206,local_780._0_16_);
              auVar184._0_4_ = auVar71._0_4_;
              auVar184._4_4_ = auVar184._0_4_;
              auVar184._8_4_ = auVar184._0_4_;
              auVar184._12_4_ = auVar184._0_4_;
              auVar78 = vfmadd132ps_fma(auVar184,auVar78,local_7a0._0_16_);
              auVar78 = vfmadd132ps_fma(_local_600,auVar78,local_760._0_16_);
              auVar185._0_4_ = auVar78._0_4_ * (float)local_620._0_4_;
              auVar185._4_4_ = auVar78._4_4_ * (float)local_620._0_4_;
              auVar185._8_4_ = auVar78._8_4_ * (float)local_620._0_4_;
              auVar185._12_4_ = auVar78._12_4_ * (float)local_620._0_4_;
              auVar78 = vdpps_avx(auVar69,auVar78,0x7f);
              fVar236 = auVar78._0_4_;
              auVar207._0_4_ = auVar69._0_4_ * fVar236;
              auVar207._4_4_ = auVar69._4_4_ * fVar236;
              auVar207._8_4_ = auVar69._8_4_ * fVar236;
              auVar207._12_4_ = auVar69._12_4_ * fVar236;
              auVar78 = vsubps_avx(auVar185,auVar207);
              fVar236 = (float)local_660._0_4_ * (float)local_640._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)local_740._0_4_),
                                   ZEXT416((uint)(local_720._0_4_ * fVar261 * 1.9073486e-06)));
              auVar208._0_4_ = auVar78._0_4_ * fVar236;
              auVar208._4_4_ = auVar78._4_4_ * fVar236;
              auVar208._8_4_ = auVar78._8_4_ * fVar236;
              auVar208._12_4_ = auVar78._12_4_ * fVar236;
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar69,auVar26);
              auVar76 = vmulps_avx512vl(auVar76,auVar208);
              auVar78 = vdpps_avx(auVar79,auVar74,0x7f);
              auVar71 = vfmadd213ss_fma(auVar85,ZEXT416((uint)local_740._0_4_),auVar72);
              auVar85 = vdpps_avx(auVar3,auVar76,0x7f);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar235 + 1.0)),
                                        ZEXT416((uint)((float)local_740._0_4_ / fVar268)),auVar71);
              fVar268 = auVar78._0_4_ + auVar85._0_4_;
              auVar85 = vdpps_avx(local_7d0,auVar74,0x7f);
              auVar78 = vdpps_avx(auVar3,auVar79,0x7f);
              auVar71 = vmulss_avx512f(auVar86,auVar73);
              auVar77 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar71._0_4_ *
                                                             auVar73._0_4_ * auVar73._0_4_)));
              auVar71 = vdpps_avx(auVar3,local_7d0,0x7f);
              auVar74 = vfnmadd231ss_fma(auVar78,auVar75,ZEXT416((uint)fVar268));
              auVar71 = vfnmadd231ss_fma(auVar71,auVar75,auVar85);
              auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar267 = fVar267 - auVar78._0_4_;
              auVar73 = vshufps_avx(auVar69,auVar69,0xff);
              auVar78 = vfmsub213ss_fma(auVar74,auVar77,auVar73);
              auVar263._8_4_ = 0x80000000;
              auVar263._0_8_ = 0x8000000080000000;
              auVar263._12_4_ = 0x80000000;
              auVar265 = ZEXT1664(auVar263);
              auVar258._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar258._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar258._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar260 = ZEXT1664(auVar258);
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * auVar77._0_4_));
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar268),auVar71);
              auVar78 = vinsertps_avx(auVar258,auVar71,0x1c);
              auVar249._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar249._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar268),auVar249,0x10);
              auVar229._0_4_ = auVar74._0_4_;
              auVar229._4_4_ = auVar229._0_4_;
              auVar229._8_4_ = auVar229._0_4_;
              auVar229._12_4_ = auVar229._0_4_;
              auVar85 = vdivps_avx(auVar78,auVar229);
              auVar78 = vdivps_avx(auVar71,auVar229);
              auVar230._0_4_ = fVar266 * auVar85._0_4_ + fVar267 * auVar78._0_4_;
              auVar230._4_4_ = fVar266 * auVar85._4_4_ + fVar267 * auVar78._4_4_;
              auVar230._8_4_ = fVar266 * auVar85._8_4_ + fVar267 * auVar78._8_4_;
              auVar230._12_4_ = fVar266 * auVar85._12_4_ + fVar267 * auVar78._12_4_;
              auVar85 = vsubps_avx(auVar271,auVar230);
              auVar272 = ZEXT1664(auVar85);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx512vl(auVar75,auVar27);
              if (auVar78._0_4_ < auVar76._0_4_) {
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar72._0_4_)),local_6c0,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar267),auVar28);
                if (auVar75._0_4_ < auVar78._0_4_) {
                  bVar62 = uVar59 < 5;
                  fVar261 = auVar85._0_4_ + (float)local_6d0._0_4_;
                  if ((fVar2 <= fVar261) &&
                     (fVar266 = *(float *)(ray + k * 4 + 0x100), fVar261 <= fVar266)) {
                    auVar78 = vmovshdup_avx(auVar85);
                    bVar58 = 0;
                    if ((auVar78._0_4_ < 0.0) || (1.0 < auVar78._0_4_)) goto LAB_018da2d1;
                    auVar231._0_12_ = ZEXT812(0);
                    auVar231._12_4_ = 0;
                    auVar209._4_8_ = auVar231._4_8_;
                    auVar209._0_4_ = local_800._0_4_;
                    auVar209._12_4_ = 0;
                    auVar78 = vrsqrt14ss_avx512f(auVar231,auVar209);
                    fVar267 = auVar78._0_4_;
                    pGVar5 = (context->scene->geometries).items[uVar4].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_018da2d1;
                      fVar267 = fVar267 * 1.5 + local_800._0_4_ * -0.5 * fVar267 * fVar267 * fVar267
                      ;
                      auVar210._0_4_ = auVar3._0_4_ * fVar267;
                      auVar210._4_4_ = auVar3._4_4_ * fVar267;
                      auVar210._8_4_ = auVar3._8_4_ * fVar267;
                      auVar210._12_4_ = auVar3._12_4_ * fVar267;
                      auVar72 = vfmadd213ps_fma(auVar73,auVar210,auVar69);
                      auVar78 = vshufps_avx(auVar210,auVar210,0xc9);
                      auVar75 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar211._0_4_ = auVar210._0_4_ * auVar75._0_4_;
                      auVar211._4_4_ = auVar210._4_4_ * auVar75._4_4_;
                      auVar211._8_4_ = auVar210._8_4_ * auVar75._8_4_;
                      auVar211._12_4_ = auVar210._12_4_ * auVar75._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar211,auVar69,auVar78);
                      auVar78 = vshufps_avx(auVar71,auVar71,0xc9);
                      auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                      auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                      auVar157._0_4_ = auVar72._0_4_ * auVar71._0_4_;
                      auVar157._4_4_ = auVar72._4_4_ * auVar71._4_4_;
                      auVar157._8_4_ = auVar72._8_4_ * auVar71._8_4_;
                      auVar157._12_4_ = auVar72._12_4_ * auVar71._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar157,auVar78,auVar75);
                      auVar233._8_4_ = 1;
                      auVar233._0_8_ = 0x100000001;
                      auVar233._12_4_ = 1;
                      auVar233._16_4_ = 1;
                      auVar233._20_4_ = 1;
                      auVar233._24_4_ = 1;
                      auVar233._28_4_ = 1;
                      local_400 = vpermps_avx2(auVar233,ZEXT1632(auVar85));
                      auVar99 = vpermps_avx2(auVar233,ZEXT1632(auVar78));
                      auVar243._8_4_ = 2;
                      auVar243._0_8_ = 0x200000002;
                      auVar243._12_4_ = 2;
                      auVar243._16_4_ = 2;
                      auVar243._20_4_ = 2;
                      auVar243._24_4_ = 2;
                      auVar243._28_4_ = 2;
                      local_440 = vpermps_avx2(auVar243,ZEXT1632(auVar78));
                      local_420 = auVar78._0_4_;
                      local_460[0] = (RTCHitN)auVar99[0];
                      local_460[1] = (RTCHitN)auVar99[1];
                      local_460[2] = (RTCHitN)auVar99[2];
                      local_460[3] = (RTCHitN)auVar99[3];
                      local_460[4] = (RTCHitN)auVar99[4];
                      local_460[5] = (RTCHitN)auVar99[5];
                      local_460[6] = (RTCHitN)auVar99[6];
                      local_460[7] = (RTCHitN)auVar99[7];
                      local_460[8] = (RTCHitN)auVar99[8];
                      local_460[9] = (RTCHitN)auVar99[9];
                      local_460[10] = (RTCHitN)auVar99[10];
                      local_460[0xb] = (RTCHitN)auVar99[0xb];
                      local_460[0xc] = (RTCHitN)auVar99[0xc];
                      local_460[0xd] = (RTCHitN)auVar99[0xd];
                      local_460[0xe] = (RTCHitN)auVar99[0xe];
                      local_460[0xf] = (RTCHitN)auVar99[0xf];
                      local_460[0x10] = (RTCHitN)auVar99[0x10];
                      local_460[0x11] = (RTCHitN)auVar99[0x11];
                      local_460[0x12] = (RTCHitN)auVar99[0x12];
                      local_460[0x13] = (RTCHitN)auVar99[0x13];
                      local_460[0x14] = (RTCHitN)auVar99[0x14];
                      local_460[0x15] = (RTCHitN)auVar99[0x15];
                      local_460[0x16] = (RTCHitN)auVar99[0x16];
                      local_460[0x17] = (RTCHitN)auVar99[0x17];
                      local_460[0x18] = (RTCHitN)auVar99[0x18];
                      local_460[0x19] = (RTCHitN)auVar99[0x19];
                      local_460[0x1a] = (RTCHitN)auVar99[0x1a];
                      local_460[0x1b] = (RTCHitN)auVar99[0x1b];
                      local_460[0x1c] = (RTCHitN)auVar99[0x1c];
                      local_460[0x1d] = (RTCHitN)auVar99[0x1d];
                      local_460[0x1e] = (RTCHitN)auVar99[0x1e];
                      local_460[0x1f] = (RTCHitN)auVar99[0x1f];
                      uStack_41c = local_420;
                      uStack_418 = local_420;
                      uStack_414 = local_420;
                      uStack_410 = local_420;
                      uStack_40c = local_420;
                      uStack_408 = local_420;
                      uStack_404 = local_420;
                      local_3e0 = ZEXT432(0) << 0x20;
                      local_3c0 = local_480._0_8_;
                      uStack_3b8 = local_480._8_8_;
                      uStack_3b0 = local_480._16_8_;
                      uStack_3a8 = local_480._24_8_;
                      local_3a0 = local_4a0;
                      vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_380 = context->user->instID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      local_360 = context->user->instPrimID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      *(float *)(ray + k * 4 + 0x100) = fVar261;
                      local_700 = local_4e0;
                      local_830.valid = (int *)local_700;
                      local_830.geometryUserPtr = pGVar5->userPtr;
                      local_830.context = context->user;
                      local_830.hit = local_460;
                      local_830.N = 8;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar260 = ZEXT1664(auVar258);
                        auVar265 = ZEXT1664(auVar263);
                        auVar272 = ZEXT1664(auVar85);
                        auVar275 = ZEXT1664(auVar3);
                        auVar279 = ZEXT1664(local_800._0_16_);
                        auVar284 = ZEXT1664(auVar69);
                        (*pGVar5->occlusionFilterN)(&local_830);
                        auVar99 = vmovdqa64_avx512vl(auVar90);
                        auVar293 = ZEXT3264(auVar99);
                        auVar99 = vmovdqa64_avx512vl(auVar89);
                        auVar292 = ZEXT3264(auVar99);
                        auVar99 = vmovdqa64_avx512vl(auVar88);
                        auVar291 = ZEXT3264(auVar99);
                      }
                      if (local_700 != (undefined1  [32])0x0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar260 = ZEXT1664(auVar260._0_16_);
                          auVar265 = ZEXT1664(auVar265._0_16_);
                          auVar272 = ZEXT1664(auVar272._0_16_);
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          auVar279 = ZEXT1664(auVar279._0_16_);
                          auVar284 = ZEXT1664(auVar284._0_16_);
                          (*p_Var9)(&local_830);
                          auVar99 = vmovdqa64_avx512vl(auVar90);
                          auVar293 = ZEXT3264(auVar99);
                          auVar99 = vmovdqa64_avx512vl(auVar89);
                          auVar292 = ZEXT3264(auVar99);
                          auVar99 = vmovdqa64_avx512vl(auVar88);
                          auVar291 = ZEXT3264(auVar99);
                        }
                        uVar63 = vptestmd_avx512vl(local_700,local_700);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar10 = (bool)((byte)uVar63 & 1);
                        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar63 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar63 >> 6) & 1);
                        bVar17 = SUB81(uVar63 >> 7,0);
                        *(uint *)(local_830.ray + 0x100) =
                             (uint)bVar10 * auVar99._0_4_ |
                             (uint)!bVar10 * *(int *)(local_830.ray + 0x100);
                        *(uint *)(local_830.ray + 0x104) =
                             (uint)bVar11 * auVar99._4_4_ |
                             (uint)!bVar11 * *(int *)(local_830.ray + 0x104);
                        *(uint *)(local_830.ray + 0x108) =
                             (uint)bVar12 * auVar99._8_4_ |
                             (uint)!bVar12 * *(int *)(local_830.ray + 0x108);
                        *(uint *)(local_830.ray + 0x10c) =
                             (uint)bVar13 * auVar99._12_4_ |
                             (uint)!bVar13 * *(int *)(local_830.ray + 0x10c);
                        *(uint *)(local_830.ray + 0x110) =
                             (uint)bVar14 * auVar99._16_4_ |
                             (uint)!bVar14 * *(int *)(local_830.ray + 0x110);
                        *(uint *)(local_830.ray + 0x114) =
                             (uint)bVar15 * auVar99._20_4_ |
                             (uint)!bVar15 * *(int *)(local_830.ray + 0x114);
                        *(uint *)(local_830.ray + 0x118) =
                             (uint)bVar16 * auVar99._24_4_ |
                             (uint)!bVar16 * *(int *)(local_830.ray + 0x118);
                        *(uint *)(local_830.ray + 0x11c) =
                             (uint)bVar17 * auVar99._28_4_ |
                             (uint)!bVar17 * *(int *)(local_830.ray + 0x11c);
                        bVar58 = 1;
                        if (local_700 != (undefined1  [32])0x0) goto LAB_018da2d1;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar266;
                    }
                  }
                  bVar58 = 0;
                  goto LAB_018da2d1;
                }
              }
              uVar59 = uVar59 + 1;
            }
            bVar62 = false;
LAB_018da2d1:
            bVar54 = bVar54 | bVar62 & bVar58;
            uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar251._4_4_ = uVar172;
            auVar251._0_4_ = uVar172;
            auVar251._8_4_ = uVar172;
            auVar251._12_4_ = uVar172;
            auVar251._16_4_ = uVar172;
            auVar251._20_4_ = uVar172;
            auVar251._24_4_ = uVar172;
            auVar251._28_4_ = uVar172;
            auVar252 = ZEXT3264(auVar251);
            auVar49._4_4_ = fStack_51c;
            auVar49._0_4_ = local_520;
            auVar49._8_4_ = fStack_518;
            auVar49._12_4_ = fStack_514;
            auVar49._16_4_ = fStack_510;
            auVar49._20_4_ = fStack_50c;
            auVar49._24_4_ = fStack_508;
            auVar49._28_4_ = fStack_504;
            uVar19 = vcmpps_avx512vl(auVar251,auVar49,0xd);
          }
          uVar21 = vpcmpd_avx512vl(local_4c0,local_300,1);
          uVar20 = vpcmpd_avx512vl(local_4c0,_local_540,1);
          auVar188._0_4_ = (float)local_560._0_4_ + (float)local_1c0._0_4_;
          auVar188._4_4_ = (float)local_560._4_4_ + (float)local_1c0._4_4_;
          auVar188._8_4_ = fStack_558 + fStack_1b8;
          auVar188._12_4_ = fStack_554 + fStack_1b4;
          auVar188._16_4_ = fStack_550 + fStack_1b0;
          auVar188._20_4_ = fStack_54c + fStack_1ac;
          auVar188._24_4_ = fStack_548 + fStack_1a8;
          auVar188._28_4_ = fStack_544 + fStack_1a4;
          uVar172 = auVar252._0_4_;
          auVar213._4_4_ = uVar172;
          auVar213._0_4_ = uVar172;
          auVar213._8_4_ = uVar172;
          auVar213._12_4_ = uVar172;
          auVar213._16_4_ = uVar172;
          auVar213._20_4_ = uVar172;
          auVar213._24_4_ = uVar172;
          auVar213._28_4_ = uVar172;
          uVar19 = vcmpps_avx512vl(auVar188,auVar213,2);
          bVar56 = bVar56 & (byte)uVar21 & (byte)uVar19;
          auVar234._0_4_ = (float)local_560._0_4_ + (float)local_340._0_4_;
          auVar234._4_4_ = (float)local_560._4_4_ + (float)local_340._4_4_;
          auVar234._8_4_ = fStack_558 + fStack_338;
          auVar234._12_4_ = fStack_554 + fStack_334;
          auVar234._16_4_ = fStack_550 + fStack_330;
          auVar234._20_4_ = fStack_54c + fStack_32c;
          auVar234._24_4_ = fStack_548 + fStack_328;
          auVar234._28_4_ = fStack_544 + fStack_324;
          uVar19 = vcmpps_avx512vl(auVar234,auVar213,2);
          bVar51 = bVar51 & (byte)uVar20 & (byte)uVar19 | bVar56;
          if (bVar51 != 0) {
            abStack_180[uVar57 * 0x60] = bVar51;
            bVar62 = (bool)(bVar56 >> 1 & 1);
            bVar10 = (bool)(bVar56 >> 2 & 1);
            bVar11 = (bool)(bVar56 >> 3 & 1);
            bVar12 = (bool)(bVar56 >> 4 & 1);
            bVar13 = (bool)(bVar56 >> 5 & 1);
            auStack_160[uVar57 * 0x18] =
                 (uint)(bVar56 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar56 & 1) * local_340._0_4_;
            auStack_160[uVar57 * 0x18 + 1] =
                 (uint)bVar62 * local_1c0._4_4_ | (uint)!bVar62 * local_340._4_4_;
            auStack_160[uVar57 * 0x18 + 2] =
                 (uint)bVar10 * (int)fStack_1b8 | (uint)!bVar10 * (int)fStack_338;
            auStack_160[uVar57 * 0x18 + 3] =
                 (uint)bVar11 * (int)fStack_1b4 | (uint)!bVar11 * (int)fStack_334;
            auStack_160[uVar57 * 0x18 + 4] =
                 (uint)bVar12 * (int)fStack_1b0 | (uint)!bVar12 * (int)fStack_330;
            auStack_160[uVar57 * 0x18 + 5] =
                 (uint)bVar13 * (int)fStack_1ac | (uint)!bVar13 * (int)fStack_32c;
            auStack_160[uVar57 * 0x18 + 6] =
                 (uint)(bVar56 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar56 >> 6) * (int)fStack_328;
            (&fStack_144)[uVar57 * 0x18] = fStack_324;
            uVar63 = vmovlps_avx(local_4f0);
            (&uStack_140)[uVar57 * 0xc] = uVar63;
            aiStack_138[uVar57 * 0x18] = local_afc + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
          auVar252 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
        }
      }
    }
    do {
      uVar64 = (uint)uVar57;
      uVar57 = (ulong)(uVar64 - 1);
      if (uVar64 == 0) {
        if (bVar54 != 0) goto LAB_018da8cb;
        uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar29._4_4_ = uVar172;
        auVar29._0_4_ = uVar172;
        auVar29._8_4_ = uVar172;
        auVar29._12_4_ = uVar172;
        uVar19 = vcmpps_avx512vl(local_500,auVar29,2);
        local_668 = (ulong)((uint)uVar19 & (uint)local_668 - 1 & (uint)local_668);
        goto LAB_018d7e12;
      }
      auVar102 = *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x18);
      auVar189._0_4_ = auVar102._0_4_ + (float)local_560._0_4_;
      auVar189._4_4_ = auVar102._4_4_ + (float)local_560._4_4_;
      auVar189._8_4_ = auVar102._8_4_ + fStack_558;
      auVar189._12_4_ = auVar102._12_4_ + fStack_554;
      auVar189._16_4_ = auVar102._16_4_ + fStack_550;
      auVar189._20_4_ = auVar102._20_4_ + fStack_54c;
      auVar189._24_4_ = auVar102._24_4_ + fStack_548;
      auVar189._28_4_ = auVar102._28_4_ + fStack_544;
      uVar172 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar172;
      auVar33._0_4_ = uVar172;
      auVar33._8_4_ = uVar172;
      auVar33._12_4_ = uVar172;
      auVar33._16_4_ = uVar172;
      auVar33._20_4_ = uVar172;
      auVar33._24_4_ = uVar172;
      auVar33._28_4_ = uVar172;
      uVar19 = vcmpps_avx512vl(auVar189,auVar33,2);
      uVar140 = (uint)uVar19 & (uint)abStack_180[uVar57 * 0x60];
    } while (uVar140 == 0);
    uVar63 = (&uStack_140)[uVar57 * 0xc];
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar63;
    auVar214._8_4_ = 0x7f800000;
    auVar214._0_8_ = 0x7f8000007f800000;
    auVar214._12_4_ = 0x7f800000;
    auVar214._16_4_ = 0x7f800000;
    auVar214._20_4_ = 0x7f800000;
    auVar214._24_4_ = 0x7f800000;
    auVar214._28_4_ = 0x7f800000;
    auVar99 = vblendmps_avx512vl(auVar214,auVar102);
    bVar51 = (byte)uVar140;
    auVar139._0_4_ =
         (uint)(bVar51 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar51 & 1) * (int)auVar102._0_4_;
    bVar62 = (bool)((byte)(uVar140 >> 1) & 1);
    auVar139._4_4_ = (uint)bVar62 * auVar99._4_4_ | (uint)!bVar62 * (int)auVar102._4_4_;
    bVar62 = (bool)((byte)(uVar140 >> 2) & 1);
    auVar139._8_4_ = (uint)bVar62 * auVar99._8_4_ | (uint)!bVar62 * (int)auVar102._8_4_;
    bVar62 = (bool)((byte)(uVar140 >> 3) & 1);
    auVar139._12_4_ = (uint)bVar62 * auVar99._12_4_ | (uint)!bVar62 * (int)auVar102._12_4_;
    bVar62 = (bool)((byte)(uVar140 >> 4) & 1);
    auVar139._16_4_ = (uint)bVar62 * auVar99._16_4_ | (uint)!bVar62 * (int)auVar102._16_4_;
    bVar62 = (bool)((byte)(uVar140 >> 5) & 1);
    auVar139._20_4_ = (uint)bVar62 * auVar99._20_4_ | (uint)!bVar62 * (int)auVar102._20_4_;
    bVar62 = (bool)((byte)(uVar140 >> 6) & 1);
    auVar139._24_4_ = (uint)bVar62 * auVar99._24_4_ | (uint)!bVar62 * (int)auVar102._24_4_;
    auVar139._28_4_ =
         (uVar140 >> 7) * auVar99._28_4_ | (uint)!SUB41(uVar140 >> 7,0) * (int)auVar102._28_4_;
    auVar102 = vshufps_avx(auVar139,auVar139,0xb1);
    auVar102 = vminps_avx(auVar139,auVar102);
    auVar99 = vshufpd_avx(auVar102,auVar102,5);
    auVar102 = vminps_avx(auVar102,auVar99);
    auVar99 = vpermpd_avx2(auVar102,0x4e);
    auVar102 = vminps_avx(auVar102,auVar99);
    uVar19 = vcmpps_avx512vl(auVar139,auVar102,0);
    bVar60 = (byte)uVar19 & bVar51;
    if (bVar60 != 0) {
      uVar140 = (uint)bVar60;
    }
    uVar141 = 0;
    for (; (uVar140 & 1) == 0; uVar140 = uVar140 >> 1 | 0x80000000) {
      uVar141 = uVar141 + 1;
    }
    local_afc = aiStack_138[uVar57 * 0x18];
    bVar51 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar51;
    abStack_180[uVar57 * 0x60] = bVar51;
    if (bVar51 == 0) {
      uVar64 = uVar64 - 1;
    }
    uVar172 = (undefined4)uVar63;
    auVar165._4_4_ = uVar172;
    auVar165._0_4_ = uVar172;
    auVar165._8_4_ = uVar172;
    auVar165._12_4_ = uVar172;
    auVar165._16_4_ = uVar172;
    auVar165._20_4_ = uVar172;
    auVar165._24_4_ = uVar172;
    auVar165._28_4_ = uVar172;
    auVar85 = vmovshdup_avx(auVar186);
    auVar85 = vsubps_avx(auVar85,auVar186);
    auVar190._0_4_ = auVar85._0_4_;
    auVar190._4_4_ = auVar190._0_4_;
    auVar190._8_4_ = auVar190._0_4_;
    auVar190._12_4_ = auVar190._0_4_;
    auVar190._16_4_ = auVar190._0_4_;
    auVar190._20_4_ = auVar190._0_4_;
    auVar190._24_4_ = auVar190._0_4_;
    auVar190._28_4_ = auVar190._0_4_;
    auVar85 = vfmadd132ps_fma(auVar190,auVar165,_DAT_01f7b040);
    auVar102 = ZEXT1632(auVar85);
    local_460[0] = (RTCHitN)auVar102[0];
    local_460[1] = (RTCHitN)auVar102[1];
    local_460[2] = (RTCHitN)auVar102[2];
    local_460[3] = (RTCHitN)auVar102[3];
    local_460[4] = (RTCHitN)auVar102[4];
    local_460[5] = (RTCHitN)auVar102[5];
    local_460[6] = (RTCHitN)auVar102[6];
    local_460[7] = (RTCHitN)auVar102[7];
    local_460[8] = (RTCHitN)auVar102[8];
    local_460[9] = (RTCHitN)auVar102[9];
    local_460[10] = (RTCHitN)auVar102[10];
    local_460[0xb] = (RTCHitN)auVar102[0xb];
    local_460[0xc] = (RTCHitN)auVar102[0xc];
    local_460[0xd] = (RTCHitN)auVar102[0xd];
    local_460[0xe] = (RTCHitN)auVar102[0xe];
    local_460[0xf] = (RTCHitN)auVar102[0xf];
    local_460[0x10] = (RTCHitN)auVar102[0x10];
    local_460[0x11] = (RTCHitN)auVar102[0x11];
    local_460[0x12] = (RTCHitN)auVar102[0x12];
    local_460[0x13] = (RTCHitN)auVar102[0x13];
    local_460[0x14] = (RTCHitN)auVar102[0x14];
    local_460[0x15] = (RTCHitN)auVar102[0x15];
    local_460[0x16] = (RTCHitN)auVar102[0x16];
    local_460[0x17] = (RTCHitN)auVar102[0x17];
    local_460[0x18] = (RTCHitN)auVar102[0x18];
    local_460[0x19] = (RTCHitN)auVar102[0x19];
    local_460[0x1a] = (RTCHitN)auVar102[0x1a];
    local_460[0x1b] = (RTCHitN)auVar102[0x1b];
    local_460[0x1c] = (RTCHitN)auVar102[0x1c];
    local_460[0x1d] = (RTCHitN)auVar102[0x1d];
    local_460[0x1e] = (RTCHitN)auVar102[0x1e];
    local_460[0x1f] = (RTCHitN)auVar102[0x1f];
    local_4f0._8_8_ = 0;
    local_4f0._0_8_ = *(ulong *)(local_460 + (ulong)uVar141 * 4);
    uVar57 = (ulong)uVar64;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }